

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  bool bVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  bool bVar72;
  undefined1 auVar73 [12];
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  uint uVar104;
  int iVar105;
  ulong uVar106;
  byte unaff_BL;
  long lVar107;
  uint uVar108;
  undefined4 uVar109;
  ulong uVar110;
  ulong uVar111;
  float fVar112;
  float fVar113;
  undefined8 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar141;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 extraout_var [60];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar227;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar226;
  undefined1 auVar225 [64];
  float fVar228;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar235;
  float fVar236;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [32];
  float fVar237;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar241 [16];
  float fVar245;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar246;
  undefined1 auVar244 [32];
  float fVar247;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar260;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar261 [32];
  float fVar276;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  float s;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float t;
  undefined1 auVar290 [16];
  undefined1 auVar280 [16];
  float fVar281;
  undefined1 in_ZMM10 [64];
  undefined1 auVar282 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar283 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar297 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar298 [64];
  float fVar299;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar305 [64];
  float fVar312;
  float fVar318;
  undefined1 auVar313 [16];
  float fVar316;
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_ca9;
  undefined1 local_ca0 [32];
  float local_ba0;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined4 local_ac0;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 auStack_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  ulong local_860;
  undefined1 auStack_858 [24];
  ulong local_840;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  uint uStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  uint uStack_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar137 [64];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar284 [64];
  undefined1 auVar289 [16];
  undefined1 auVar300 [32];
  
  PVar7 = prim[1];
  uVar106 = (ulong)(byte)PVar7;
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar112 = *(float *)(prim + uVar106 * 0x19 + 0x12);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + uVar106 * 0x19 + 6));
  auVar115._0_4_ = fVar112 * auVar10._0_4_;
  auVar115._4_4_ = fVar112 * auVar10._4_4_;
  auVar115._8_4_ = fVar112 * auVar10._8_4_;
  auVar115._12_4_ = fVar112 * auVar10._12_4_;
  auVar180._0_4_ = fVar112 * auVar11._0_4_;
  auVar180._4_4_ = fVar112 * auVar11._4_4_;
  auVar180._8_4_ = fVar112 * auVar11._8_4_;
  auVar180._12_4_ = fVar112 * auVar11._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar106 * 4 + 6);
  auVar132 = vpmovsxbd_avx2(auVar10);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar106 * 5 + 6);
  auVar133 = vpmovsxbd_avx2(auVar11);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar106 * 6 + 6);
  auVar233 = vpmovsxbd_avx2(auVar2);
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 6);
  auVar13 = vpmovsxbd_avx2(auVar3);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar222 = vpmovsxbd_avx2(auVar4);
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar106 + 6);
  auVar14 = vpmovsxbd_avx2(auVar5);
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar110 = (ulong)(uint)((int)(uVar106 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar110 + 6);
  auVar131 = vpmovsxbd_avx2(auVar6);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar313._8_8_ = 0;
  auVar313._0_8_ = *(ulong *)(prim + uVar110 + uVar106 + 6);
  auVar15 = vpmovsxbd_avx2(auVar313);
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar110 = (ulong)(uint)((int)(uVar106 * 5) << 2);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + uVar110 + 6);
  auVar153 = vpmovsxbd_avx2(auVar290);
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar251._4_4_ = auVar180._0_4_;
  auVar251._0_4_ = auVar180._0_4_;
  auVar251._8_4_ = auVar180._0_4_;
  auVar251._12_4_ = auVar180._0_4_;
  auVar251._16_4_ = auVar180._0_4_;
  auVar251._20_4_ = auVar180._0_4_;
  auVar251._24_4_ = auVar180._0_4_;
  auVar251._28_4_ = auVar180._0_4_;
  auVar10 = vmovshdup_avx(auVar180);
  uVar114 = auVar10._0_8_;
  auVar314._8_8_ = uVar114;
  auVar314._0_8_ = uVar114;
  auVar314._16_8_ = uVar114;
  auVar314._24_8_ = uVar114;
  auVar10 = vshufps_avx(auVar180,auVar180,0xaa);
  fVar112 = auVar10._0_4_;
  auVar272._0_4_ = fVar112 * auVar233._0_4_;
  fVar141 = auVar10._4_4_;
  auVar272._4_4_ = fVar141 * auVar233._4_4_;
  auVar272._8_4_ = fVar112 * auVar233._8_4_;
  auVar272._12_4_ = fVar141 * auVar233._12_4_;
  auVar272._16_4_ = fVar112 * auVar233._16_4_;
  auVar272._20_4_ = fVar141 * auVar233._20_4_;
  auVar272._28_36_ = in_ZMM12._28_36_;
  auVar272._24_4_ = fVar112 * auVar233._24_4_;
  auVar305._0_4_ = auVar14._0_4_ * fVar112;
  auVar305._4_4_ = auVar14._4_4_ * fVar141;
  auVar305._8_4_ = auVar14._8_4_ * fVar112;
  auVar305._12_4_ = auVar14._12_4_ * fVar141;
  auVar305._16_4_ = auVar14._16_4_ * fVar112;
  auVar305._20_4_ = auVar14._20_4_ * fVar141;
  auVar305._28_36_ = in_ZMM10._28_36_;
  auVar305._24_4_ = auVar14._24_4_ * fVar112;
  auVar127._0_4_ = auVar153._0_4_ * fVar112;
  auVar127._4_4_ = auVar153._4_4_ * fVar141;
  auVar127._8_4_ = auVar153._8_4_ * fVar112;
  auVar127._12_4_ = auVar153._12_4_ * fVar141;
  auVar127._16_4_ = auVar153._16_4_ * fVar112;
  auVar127._20_4_ = auVar153._20_4_ * fVar141;
  auVar127._24_4_ = auVar153._24_4_ * fVar112;
  auVar127._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(auVar272._0_32_,auVar314,auVar133);
  auVar11 = vfmadd231ps_fma(auVar305._0_32_,auVar314,auVar222);
  auVar2 = vfmadd231ps_fma(auVar127,auVar15,auVar314);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar251,auVar132);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar251,auVar13);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar131,auVar251);
  auVar300._4_4_ = auVar115._0_4_;
  auVar300._0_4_ = auVar115._0_4_;
  auVar300._8_4_ = auVar115._0_4_;
  auVar300._12_4_ = auVar115._0_4_;
  auVar300._16_4_ = auVar115._0_4_;
  auVar300._20_4_ = auVar115._0_4_;
  auVar300._24_4_ = auVar115._0_4_;
  auVar300._28_4_ = auVar115._0_4_;
  auVar305 = ZEXT3264(auVar300);
  auVar10 = vmovshdup_avx(auVar115);
  uVar114 = auVar10._0_8_;
  auVar315._8_8_ = uVar114;
  auVar315._0_8_ = uVar114;
  auVar315._16_8_ = uVar114;
  auVar315._24_8_ = uVar114;
  auVar10 = vshufps_avx(auVar115,auVar115,0xaa);
  fVar112 = auVar10._0_4_;
  auVar242._0_4_ = fVar112 * auVar233._0_4_;
  fVar141 = auVar10._4_4_;
  auVar242._4_4_ = fVar141 * auVar233._4_4_;
  auVar242._8_4_ = fVar112 * auVar233._8_4_;
  auVar242._12_4_ = fVar141 * auVar233._12_4_;
  auVar242._16_4_ = fVar112 * auVar233._16_4_;
  auVar242._20_4_ = fVar141 * auVar233._20_4_;
  auVar242._24_4_ = fVar112 * auVar233._24_4_;
  auVar242._28_4_ = 0;
  auVar268._4_4_ = auVar14._4_4_ * fVar141;
  auVar268._0_4_ = auVar14._0_4_ * fVar112;
  auVar268._8_4_ = auVar14._8_4_ * fVar112;
  auVar268._12_4_ = auVar14._12_4_ * fVar141;
  auVar268._16_4_ = auVar14._16_4_ * fVar112;
  auVar268._20_4_ = auVar14._20_4_ * fVar141;
  auVar268._24_4_ = auVar14._24_4_ * fVar112;
  auVar268._28_4_ = auVar233._28_4_;
  auVar233._4_4_ = auVar153._4_4_ * fVar141;
  auVar233._0_4_ = auVar153._0_4_ * fVar112;
  auVar233._8_4_ = auVar153._8_4_ * fVar112;
  auVar233._12_4_ = auVar153._12_4_ * fVar141;
  auVar233._16_4_ = auVar153._16_4_ * fVar112;
  auVar233._20_4_ = auVar153._20_4_ * fVar141;
  auVar233._24_4_ = auVar153._24_4_ * fVar112;
  auVar233._28_4_ = fVar141;
  auVar10 = vfmadd231ps_fma(auVar242,auVar315,auVar133);
  auVar4 = vfmadd231ps_fma(auVar268,auVar315,auVar222);
  auVar5 = vfmadd231ps_fma(auVar233,auVar315,auVar15);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar300,auVar132);
  local_900._8_4_ = 0x7fffffff;
  local_900._0_8_ = 0x7fffffff7fffffff;
  local_900._12_4_ = 0x7fffffff;
  local_900._16_4_ = 0x7fffffff;
  local_900._20_4_ = 0x7fffffff;
  local_900._24_4_ = 0x7fffffff;
  local_900._28_4_ = 0x7fffffff;
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar300,auVar13);
  auVar132 = vandps_avx(ZEXT1632(auVar3),local_900);
  auVar184._8_4_ = 0x219392ef;
  auVar184._0_8_ = 0x219392ef219392ef;
  auVar184._12_4_ = 0x219392ef;
  auVar184._16_4_ = 0x219392ef;
  auVar184._20_4_ = 0x219392ef;
  auVar184._24_4_ = 0x219392ef;
  auVar184._28_4_ = 0x219392ef;
  auVar132 = vcmpps_avx(auVar132,auVar184,1);
  auVar133 = vblendvps_avx(ZEXT1632(auVar3),auVar184,auVar132);
  auVar132 = vandps_avx(ZEXT1632(auVar11),local_900);
  auVar132 = vcmpps_avx(auVar132,auVar184,1);
  auVar233 = vblendvps_avx(ZEXT1632(auVar11),auVar184,auVar132);
  auVar132 = vandps_avx(ZEXT1632(auVar2),local_900);
  auVar132 = vcmpps_avx(auVar132,auVar184,1);
  auVar13 = vrcpps_avx(auVar133);
  auVar132 = vblendvps_avx(ZEXT1632(auVar2),auVar184,auVar132);
  auVar261._8_4_ = 0x3f800000;
  auVar261._0_8_ = &DAT_3f8000003f800000;
  auVar261._12_4_ = 0x3f800000;
  auVar261._16_4_ = 0x3f800000;
  auVar261._20_4_ = 0x3f800000;
  auVar261._24_4_ = 0x3f800000;
  auVar261._28_4_ = 0x3f800000;
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar300,auVar131);
  auVar222 = vrcpps_avx(auVar233);
  auVar10 = vfnmadd213ps_fma(auVar133,auVar13,auVar261);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar13,auVar13);
  auVar11 = vfnmadd213ps_fma(auVar233,auVar222,auVar261);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar222,auVar222);
  auVar133 = vrcpps_avx(auVar132);
  auVar2 = vfnmadd213ps_fma(auVar132,auVar133,auVar261);
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 7 + 6));
  auVar2 = vfmadd132ps_fma(ZEXT1632(auVar2),auVar133,auVar133);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,ZEXT1632(auVar6));
  auVar13._4_4_ = auVar10._4_4_ * auVar132._4_4_;
  auVar13._0_4_ = auVar10._0_4_ * auVar132._0_4_;
  auVar13._8_4_ = auVar10._8_4_ * auVar132._8_4_;
  auVar13._12_4_ = auVar10._12_4_ * auVar132._12_4_;
  auVar13._16_4_ = auVar132._16_4_ * 0.0;
  auVar13._20_4_ = auVar132._20_4_ * 0.0;
  auVar13._24_4_ = auVar132._24_4_ * 0.0;
  auVar13._28_4_ = auVar132._28_4_;
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 9 + 6));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,ZEXT1632(auVar6));
  auVar231._0_4_ = auVar10._0_4_ * auVar132._0_4_;
  auVar231._4_4_ = auVar10._4_4_ * auVar132._4_4_;
  auVar231._8_4_ = auVar10._8_4_ * auVar132._8_4_;
  auVar231._12_4_ = auVar10._12_4_ * auVar132._12_4_;
  auVar231._16_4_ = auVar132._16_4_ * 0.0;
  auVar231._20_4_ = auVar132._20_4_ * 0.0;
  auVar231._24_4_ = auVar132._24_4_ * 0.0;
  auVar231._28_4_ = 0;
  auVar153._1_3_ = 0;
  auVar153[0] = PVar7;
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar7 * 0x10 + uVar106 * -2 + 6));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,ZEXT1632(auVar4));
  auVar222._4_4_ = auVar132._4_4_ * auVar11._4_4_;
  auVar222._0_4_ = auVar132._0_4_ * auVar11._0_4_;
  auVar222._8_4_ = auVar132._8_4_ * auVar11._8_4_;
  auVar222._12_4_ = auVar132._12_4_ * auVar11._12_4_;
  auVar222._16_4_ = auVar132._16_4_ * 0.0;
  auVar222._20_4_ = auVar132._20_4_ * 0.0;
  auVar222._24_4_ = auVar132._24_4_ * 0.0;
  auVar222._28_4_ = auVar132._28_4_;
  auVar132 = vcvtdq2ps_avx(auVar133);
  auVar132 = vsubps_avx(auVar132,ZEXT1632(auVar4));
  auVar14._4_4_ = auVar11._4_4_ * auVar132._4_4_;
  auVar14._0_4_ = auVar11._0_4_ * auVar132._0_4_;
  auVar14._8_4_ = auVar11._8_4_ * auVar132._8_4_;
  auVar14._12_4_ = auVar11._12_4_ * auVar132._12_4_;
  auVar14._16_4_ = auVar132._16_4_ * 0.0;
  auVar14._20_4_ = auVar132._20_4_ * 0.0;
  auVar14._24_4_ = auVar132._24_4_ * 0.0;
  auVar14._28_4_ = auVar132._28_4_;
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 + uVar106 + 6));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,ZEXT1632(auVar3));
  auVar131._4_4_ = auVar132._4_4_ * auVar2._4_4_;
  auVar131._0_4_ = auVar132._0_4_ * auVar2._0_4_;
  auVar131._8_4_ = auVar132._8_4_ * auVar2._8_4_;
  auVar131._12_4_ = auVar132._12_4_ * auVar2._12_4_;
  auVar131._16_4_ = auVar132._16_4_ * 0.0;
  auVar131._20_4_ = auVar132._20_4_ * 0.0;
  auVar131._24_4_ = auVar132._24_4_ * 0.0;
  auVar131._28_4_ = auVar132._28_4_;
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 0x17 + 6));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,ZEXT1632(auVar3));
  auVar15._4_4_ = auVar2._4_4_ * auVar132._4_4_;
  auVar15._0_4_ = auVar2._0_4_ * auVar132._0_4_;
  auVar15._8_4_ = auVar2._8_4_ * auVar132._8_4_;
  auVar15._12_4_ = auVar2._12_4_ * auVar132._12_4_;
  auVar15._16_4_ = auVar132._16_4_ * 0.0;
  auVar15._20_4_ = auVar132._20_4_ * 0.0;
  auVar15._24_4_ = auVar132._24_4_ * 0.0;
  auVar15._28_4_ = auVar132._28_4_;
  auVar132 = vpminsd_avx2(auVar13,auVar231);
  auVar133 = vpminsd_avx2(auVar222,auVar14);
  auVar132 = vmaxps_avx(auVar132,auVar133);
  auVar133 = vpminsd_avx2(auVar131,auVar15);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar277._4_4_ = uVar109;
  auVar277._0_4_ = uVar109;
  auVar277._8_4_ = uVar109;
  auVar277._12_4_ = uVar109;
  auVar277._16_4_ = uVar109;
  auVar277._20_4_ = uVar109;
  auVar277._24_4_ = uVar109;
  auVar277._28_4_ = uVar109;
  auVar133 = vmaxps_avx(auVar133,auVar277);
  auVar132 = vmaxps_avx(auVar132,auVar133);
  local_280._4_4_ = auVar132._4_4_ * 0.99999964;
  local_280._0_4_ = auVar132._0_4_ * 0.99999964;
  local_280._8_4_ = auVar132._8_4_ * 0.99999964;
  local_280._12_4_ = auVar132._12_4_ * 0.99999964;
  local_280._16_4_ = auVar132._16_4_ * 0.99999964;
  local_280._20_4_ = auVar132._20_4_ * 0.99999964;
  local_280._24_4_ = auVar132._24_4_ * 0.99999964;
  local_280._28_4_ = 0x3f7ffffa;
  auVar132 = vpmaxsd_avx2(auVar13,auVar231);
  auVar133 = vpmaxsd_avx2(auVar222,auVar14);
  auVar132 = vminps_avx(auVar132,auVar133);
  auVar133 = vpmaxsd_avx2(auVar131,auVar15);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar182._4_4_ = uVar109;
  auVar182._0_4_ = uVar109;
  auVar182._8_4_ = uVar109;
  auVar182._12_4_ = uVar109;
  auVar182._16_4_ = uVar109;
  auVar182._20_4_ = uVar109;
  auVar182._24_4_ = uVar109;
  auVar182._28_4_ = uVar109;
  auVar133 = vminps_avx(auVar133,auVar182);
  auVar132 = vminps_avx(auVar132,auVar133);
  auVar133._4_4_ = auVar132._4_4_ * 1.0000004;
  auVar133._0_4_ = auVar132._0_4_ * 1.0000004;
  auVar133._8_4_ = auVar132._8_4_ * 1.0000004;
  auVar133._12_4_ = auVar132._12_4_ * 1.0000004;
  auVar133._16_4_ = auVar132._16_4_ * 1.0000004;
  auVar133._20_4_ = auVar132._20_4_ * 1.0000004;
  auVar133._24_4_ = auVar132._24_4_ * 1.0000004;
  auVar133._28_4_ = auVar132._28_4_;
  auVar153[4] = PVar7;
  auVar153._5_3_ = 0;
  auVar153[8] = PVar7;
  auVar153._9_3_ = 0;
  auVar153[0xc] = PVar7;
  auVar153._13_3_ = 0;
  auVar153[0x10] = PVar7;
  auVar153._17_3_ = 0;
  auVar153[0x14] = PVar7;
  auVar153._21_3_ = 0;
  auVar153[0x18] = PVar7;
  auVar153._25_3_ = 0;
  auVar153[0x1c] = PVar7;
  auVar153._29_3_ = 0;
  auVar132 = vcmpps_avx(local_280,auVar133,2);
  auVar133 = vpcmpgtd_avx2(auVar153,_DAT_0205a920);
  auVar132 = vandps_avx(auVar132,auVar133);
  uVar104 = vmovmskps_avx(auVar132);
  local_ca9 = uVar104 != 0;
  if (uVar104 == 0) {
    return local_ca9;
  }
  auVar132._16_16_ = mm_lookupmask_ps._240_16_;
  auVar132._0_16_ = mm_lookupmask_ps._240_16_;
  uVar104 = uVar104 & 0xff;
  local_220 = vblendps_avx(auVar132,ZEXT832(0) << 0x20,0x80);
  iVar105 = 1 << ((uint)k & 0x1f);
  auVar125._4_4_ = iVar105;
  auVar125._0_4_ = iVar105;
  auVar125._8_4_ = iVar105;
  auVar125._12_4_ = iVar105;
  auVar125._16_4_ = iVar105;
  auVar125._20_4_ = iVar105;
  auVar125._24_4_ = iVar105;
  auVar125._28_4_ = iVar105;
  auVar133 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar132 = vpand_avx2(auVar125,auVar133);
  local_660 = vpcmpeqd_avx2(auVar132,auVar133);
  local_760 = 0x80000000;
  uStack_75c = 0x80000000;
  uStack_758 = 0x80000000;
  uStack_754 = 0x80000000;
  fStack_750 = -0.0;
  fStack_74c = -0.0;
  fStack_748 = -0.0;
  uStack_744 = 0x80000000;
  local_930 = prim;
LAB_0189eb05:
  lVar107 = 0;
  local_928 = (ulong)uVar104;
  for (uVar110 = local_928; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
    lVar107 = lVar107 + 1;
  }
  uVar104 = *(uint *)(local_930 + 2);
  local_620 = *(uint *)(local_930 + lVar107 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar104].ptr;
  uVar110 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                            pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)local_620);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar107 = *(long *)&pGVar8[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar107 + (long)p_Var9 * uVar110);
  auVar11 = *(undefined1 (*) [16])(lVar107 + (uVar110 + 1) * (long)p_Var9);
  auVar2 = *(undefined1 (*) [16])(lVar107 + (uVar110 + 2) * (long)p_Var9);
  auVar272 = ZEXT1664(auVar2);
  local_928 = local_928 - 1 & local_928;
  if (local_928 != 0) {
    uVar111 = local_928 - 1 & local_928;
    for (uVar106 = local_928; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
    }
    if (uVar111 != 0) {
      for (; (uVar111 & 1) == 0; uVar111 = uVar111 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar4 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar112 = *(float *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = fVar112;
  auVar121._0_4_ = fVar112;
  auVar121._8_4_ = fVar112;
  auVar121._12_4_ = fVar112;
  auVar183._16_4_ = fVar112;
  auVar183._0_16_ = auVar121;
  auVar183._20_4_ = fVar112;
  auVar183._24_4_ = fVar112;
  auVar183._28_4_ = fVar112;
  uVar109 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar282._4_4_ = uVar109;
  auVar282._0_4_ = uVar109;
  auVar282._8_4_ = uVar109;
  auVar282._12_4_ = uVar109;
  fStack_8d0 = (float)uVar109;
  _local_8e0 = auVar282;
  fStack_8cc = (float)uVar109;
  fStack_8c8 = (float)uVar109;
  register0x000014dc = uVar109;
  auVar284 = ZEXT3264(_local_8e0);
  auVar3 = vunpcklps_avx(auVar121,auVar282);
  fVar141 = *(float *)(ray + k * 4 + 0xc0);
  auVar289._4_4_ = fVar141;
  auVar289._0_4_ = fVar141;
  auVar289._8_4_ = fVar141;
  auVar289._12_4_ = fVar141;
  auVar298 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar141,CONCAT420(fVar141,CONCAT416(fVar141,
                                                  auVar289)))));
  local_9d0 = vinsertps_avx(auVar3,auVar289,0x28);
  auVar150._0_4_ = (auVar10._0_4_ + auVar11._0_4_) * 0.5;
  auVar150._4_4_ = (auVar10._4_4_ + auVar11._4_4_) * 0.5;
  auVar150._8_4_ = (auVar10._8_4_ + auVar11._8_4_) * 0.5;
  auVar150._12_4_ = (auVar10._12_4_ + auVar11._12_4_) * 0.5;
  auVar3 = vsubps_avx(auVar150,auVar4);
  auVar3 = vdpps_avx(auVar3,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar5 = vrcpss_avx(local_9e0,local_9e0);
  auVar6 = vfnmadd213ss_fma(auVar5,local_9e0,ZEXT416(0x40000000));
  fVar12 = auVar3._0_4_ * auVar5._0_4_ * auVar6._0_4_;
  auVar241._4_4_ = fVar12;
  auVar241._0_4_ = fVar12;
  auVar241._8_4_ = fVar12;
  auVar241._12_4_ = fVar12;
  auVar3 = vfmadd231ps_fma(auVar4,local_9d0,auVar241);
  auVar3 = vblendps_avx(auVar3,_DAT_01feba10,8);
  auVar4 = vsubps_avx(auVar10,auVar3);
  auVar2 = vsubps_avx(auVar2,auVar3);
  auVar5 = vsubps_avx(auVar11,auVar3);
  auVar3 = vsubps_avx(*(undefined1 (*) [16])(lVar107 + (uVar110 + 3) * (long)p_Var9),auVar3);
  auVar217 = ZEXT1664(auVar3);
  auVar10 = vmovshdup_avx(auVar4);
  local_1a0 = auVar10._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar10 = vshufps_avx(auVar4,auVar4,0xaa);
  local_1c0 = auVar10._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar10 = vshufps_avx(auVar4,auVar4,0xff);
  local_460 = auVar10._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar10 = vmovshdup_avx(auVar5);
  local_1e0 = auVar10._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar10 = vshufps_avx(auVar5,auVar5,0xaa);
  local_480 = auVar10._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar10 = vshufps_avx(auVar5,auVar5,0xff);
  local_4a0 = auVar10._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar10 = vmovshdup_avx(auVar2);
  local_4c0 = auVar10._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar10 = vshufps_avx(auVar2,auVar2,0xaa);
  local_4e0 = auVar10._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar10 = vshufps_avx(auVar2,auVar2,0xff);
  uVar114 = auVar10._0_8_;
  local_5c0._8_8_ = uVar114;
  local_5c0._0_8_ = uVar114;
  local_5c0._16_8_ = uVar114;
  local_5c0._24_8_ = uVar114;
  auVar10 = vmovshdup_avx(auVar3);
  local_500 = auVar10._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar10 = vshufps_avx(auVar3,auVar3,0xaa);
  local_520 = auVar10._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar10 = vshufps_avx(auVar3,auVar3,0xff);
  local_540 = auVar10._0_8_;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  auVar10 = vfmadd231ps_fma(ZEXT432((uint)(fVar141 * fVar141)),_local_8e0,_local_8e0);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar183,auVar183);
  uVar109 = auVar10._0_4_;
  local_200._4_4_ = uVar109;
  local_200._0_4_ = uVar109;
  local_200._8_4_ = uVar109;
  local_200._12_4_ = uVar109;
  local_200._16_4_ = uVar109;
  local_200._20_4_ = uVar109;
  local_200._24_4_ = uVar109;
  local_200._28_4_ = uVar109;
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  local_950 = ZEXT416((uint)fVar12);
  local_260 = fVar1 - fVar12;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_600 = uVar104;
  uStack_5fc = uVar104;
  uStack_5f8 = uVar104;
  uStack_5f4 = uVar104;
  uStack_5f0 = uVar104;
  uStack_5ec = uVar104;
  uStack_5e8 = uVar104;
  uStack_5e4 = uVar104;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  uVar110 = 1;
  local_840 = 0;
  local_560 = auVar4._0_4_;
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  local_580 = auVar5._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  local_5a0 = auVar2._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  fVar194 = auVar3._0_4_;
  local_5e0 = vandps_avx(local_200,local_900);
  auVar10 = vsqrtss_avx(local_9e0,local_9e0);
  auVar11 = vsqrtss_avx(local_9e0,local_9e0);
  local_940 = ZEXT816(0x3f80000000000000);
  auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_240 = fVar194;
  fStack_23c = fVar194;
  fStack_238 = fVar194;
  fStack_234 = fVar194;
  fStack_230 = fVar194;
  fStack_22c = fVar194;
  fStack_228 = fVar194;
  fStack_224 = fVar194;
  uVar106 = 0;
  fVar276 = 0.0;
  do {
    auVar6 = vmovshdup_avx(local_940);
    fVar253 = local_940._0_4_;
    fVar247 = auVar6._0_4_ - fVar253;
    fVar113 = fVar247 * 0.04761905;
    auVar243._4_4_ = fVar253;
    auVar243._0_4_ = fVar253;
    auVar243._8_4_ = fVar253;
    auVar243._12_4_ = fVar253;
    auVar243._16_4_ = fVar253;
    auVar243._20_4_ = fVar253;
    auVar243._24_4_ = fVar253;
    auVar243._28_4_ = fVar253;
    auVar126._4_4_ = fVar247;
    auVar126._0_4_ = fVar247;
    auVar126._8_4_ = fVar247;
    auVar126._12_4_ = fVar247;
    auVar126._16_4_ = fVar247;
    auVar126._20_4_ = fVar247;
    auVar126._24_4_ = fVar247;
    auVar126._28_4_ = fVar247;
    auVar6 = vfmadd231ps_fma(auVar243,auVar126,_DAT_02020f20);
    auVar132 = vsubps_avx(auVar225._0_32_,ZEXT1632(auVar6));
    fVar226 = auVar6._0_4_;
    fVar227 = auVar6._4_4_;
    fVar245 = auVar6._8_4_;
    fVar246 = auVar6._12_4_;
    fVar247 = auVar132._0_4_;
    fVar253 = auVar132._4_4_;
    fVar254 = auVar132._8_4_;
    fVar255 = auVar132._12_4_;
    fVar256 = auVar132._16_4_;
    fVar257 = auVar132._20_4_;
    fVar258 = auVar132._24_4_;
    auVar217._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * fVar246,
                            CONCAT48(fVar245 * fVar245,CONCAT44(fVar227 * fVar227,fVar226 * fVar226)
                                    )));
    fVar260 = fVar226 * 3.0;
    fVar273 = fVar227 * 3.0;
    fVar274 = fVar245 * 3.0;
    fVar275 = fVar246 * 3.0;
    fVar281 = auVar272._28_4_ + -5.0;
    auVar225._0_4_ = fVar247 * fVar247;
    auVar225._4_4_ = fVar253 * fVar253;
    auVar225._8_4_ = fVar254 * fVar254;
    auVar225._12_4_ = fVar255 * fVar255;
    auVar225._16_4_ = fVar256 * fVar256;
    auVar225._20_4_ = fVar257 * fVar257;
    auVar225._28_36_ = auVar284._28_36_;
    auVar225._24_4_ = fVar258 * fVar258;
    fVar259 = auVar132._28_4_;
    auVar284._0_4_ = (auVar225._0_4_ * (fVar247 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar284._4_4_ = (auVar225._4_4_ * (fVar253 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar284._8_4_ = (auVar225._8_4_ * (fVar254 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar284._12_4_ = (auVar225._12_4_ * (fVar255 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar284._16_4_ = (auVar225._16_4_ * (fVar256 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar284._20_4_ = (auVar225._20_4_ * (fVar257 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar284._28_36_ = auVar305._28_36_;
    auVar284._24_4_ = (auVar225._24_4_ * (fVar258 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar132 = auVar284._0_32_;
    fVar228 = fVar226 * fVar226 * (float)((uint)fVar247 ^ local_760) * 0.5;
    fVar235 = fVar227 * fVar227 * (float)((uint)fVar253 ^ uStack_75c) * 0.5;
    fVar236 = fVar245 * fVar245 * (float)((uint)fVar254 ^ uStack_758) * 0.5;
    fVar237 = fVar246 * fVar246 * (float)((uint)fVar255 ^ uStack_754) * 0.5;
    fVar238 = (float)((uint)fVar256 ^ (uint)fStack_750) * 0.0 * 0.0 * 0.5;
    fVar239 = (float)((uint)fVar257 ^ (uint)fStack_74c) * 0.0 * 0.0 * 0.5;
    fVar240 = (float)((uint)fVar258 ^ (uint)fStack_748) * 0.0 * 0.0 * 0.5;
    auVar16._4_4_ = fStack_23c * fVar235;
    auVar16._0_4_ = local_240 * fVar228;
    auVar16._8_4_ = fStack_238 * fVar236;
    auVar16._12_4_ = fStack_234 * fVar237;
    auVar16._16_4_ = fStack_230 * fVar238;
    auVar16._20_4_ = fStack_22c * fVar239;
    auVar16._24_4_ = fStack_228 * fVar240;
    auVar16._28_4_ = uStack_744;
    auVar17._4_4_ = fVar235 * local_500._4_4_;
    auVar17._0_4_ = fVar228 * (float)local_500;
    auVar17._8_4_ = fVar236 * (float)uStack_4f8;
    auVar17._12_4_ = fVar237 * uStack_4f8._4_4_;
    auVar17._16_4_ = fVar238 * (float)uStack_4f0;
    auVar17._20_4_ = fVar239 * uStack_4f0._4_4_;
    auVar17._24_4_ = fVar240 * (float)uStack_4e8;
    auVar17._28_4_ = 0;
    auVar18._4_4_ = fVar235 * local_520._4_4_;
    auVar18._0_4_ = fVar228 * (float)local_520;
    auVar18._8_4_ = fVar236 * (float)uStack_518;
    auVar18._12_4_ = fVar237 * uStack_518._4_4_;
    auVar18._16_4_ = fVar238 * (float)uStack_510;
    auVar18._20_4_ = fVar239 * uStack_510._4_4_;
    auVar18._24_4_ = fVar240 * (float)uStack_508;
    auVar18._28_4_ = 0x40000000;
    auVar19._4_4_ = fVar235 * local_540._4_4_;
    auVar19._0_4_ = fVar228 * (float)local_540;
    auVar19._8_4_ = fVar236 * (float)uStack_538;
    auVar19._12_4_ = fVar237 * uStack_538._4_4_;
    auVar19._16_4_ = fVar238 * (float)uStack_530;
    auVar19._20_4_ = fVar239 * uStack_530._4_4_;
    auVar19._24_4_ = fVar240 * (float)uStack_528;
    auVar19._28_4_ = fVar276;
    auVar84._4_4_ = uStack_59c;
    auVar84._0_4_ = local_5a0;
    auVar84._8_4_ = uStack_598;
    auVar84._12_4_ = uStack_594;
    auVar84._16_4_ = uStack_590;
    auVar84._20_4_ = uStack_58c;
    auVar84._24_4_ = uStack_588;
    auVar84._28_4_ = uStack_584;
    auVar6 = vfmadd231ps_fma(auVar16,auVar132,auVar84);
    auVar92._8_8_ = uStack_4b8;
    auVar92._0_8_ = local_4c0;
    auVar92._16_8_ = uStack_4b0;
    auVar92._24_8_ = uStack_4a8;
    auVar313 = vfmadd231ps_fma(auVar17,auVar132,auVar92);
    auVar90._8_8_ = uStack_4d8;
    auVar90._0_8_ = local_4e0;
    auVar90._16_8_ = uStack_4d0;
    auVar90._24_8_ = uStack_4c8;
    auVar290 = vfmadd231ps_fma(auVar18,auVar132,auVar90);
    auVar115 = vfmadd231ps_fma(auVar19,local_5c0,auVar132);
    auVar20._4_4_ = fVar253 * fVar253 * (float)((uint)fVar227 ^ uStack_75c) * 0.5;
    auVar20._0_4_ = fVar247 * fVar247 * (float)((uint)fVar226 ^ local_760) * 0.5;
    auVar20._8_4_ = fVar254 * fVar254 * (float)((uint)fVar245 ^ uStack_758) * 0.5;
    auVar20._12_4_ = fVar255 * fVar255 * (float)((uint)fVar246 ^ uStack_754) * 0.5;
    auVar20._16_4_ = fVar256 * fVar256 * fStack_750 * 0.5;
    auVar20._20_4_ = fVar257 * fVar257 * fStack_74c * 0.5;
    auVar20._24_4_ = fVar258 * fVar258 * fStack_748 * 0.5;
    auVar20._28_4_ = auVar298._28_4_;
    auVar21._4_4_ = ((fVar273 + -5.0) * fVar227 * fVar227 + 2.0) * 0.5;
    auVar21._0_4_ = ((fVar260 + -5.0) * fVar226 * fVar226 + 2.0) * 0.5;
    auVar21._8_4_ = ((fVar274 + -5.0) * fVar245 * fVar245 + 2.0) * 0.5;
    auVar21._12_4_ = ((fVar275 + -5.0) * fVar246 * fVar246 + 2.0) * 0.5;
    auVar21._16_4_ = 0x3f800000;
    auVar21._20_4_ = 0x3f800000;
    auVar21._24_4_ = 0x3f800000;
    auVar21._28_4_ = auVar305._28_4_ + 2.0;
    auVar86._4_4_ = uStack_57c;
    auVar86._0_4_ = local_580;
    auVar86._8_4_ = uStack_578;
    auVar86._12_4_ = uStack_574;
    auVar86._16_4_ = uStack_570;
    auVar86._20_4_ = uStack_56c;
    auVar86._24_4_ = uStack_568;
    auVar86._28_4_ = uStack_564;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar21,auVar86);
    auVar101._8_8_ = uStack_1d8;
    auVar101._0_8_ = local_1e0;
    auVar101._16_8_ = uStack_1d0;
    auVar101._24_8_ = uStack_1c8;
    auVar313 = vfmadd231ps_fma(ZEXT1632(auVar313),auVar21,auVar101);
    auVar96._8_8_ = uStack_478;
    auVar96._0_8_ = local_480;
    auVar96._16_8_ = uStack_470;
    auVar96._24_8_ = uStack_468;
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar21,auVar96);
    auVar94._8_8_ = uStack_498;
    auVar94._0_8_ = local_4a0;
    auVar94._16_8_ = uStack_490;
    auVar94._24_8_ = uStack_488;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar21,auVar94);
    auVar88._4_4_ = uStack_55c;
    auVar88._0_4_ = local_560;
    auVar88._8_4_ = uStack_558;
    auVar88._12_4_ = uStack_554;
    auVar88._16_4_ = uStack_550;
    auVar88._20_4_ = uStack_54c;
    auVar88._24_4_ = uStack_548;
    auVar88._28_4_ = uStack_544;
    auVar180 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar20,auVar88);
    auVar103._8_8_ = uStack_198;
    auVar103._0_8_ = local_1a0;
    auVar103._16_8_ = uStack_190;
    auVar103._24_8_ = uStack_188;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar313),auVar20,auVar103);
    auVar127 = ZEXT1632(auVar6);
    auVar102._8_8_ = uStack_1b8;
    auVar102._0_8_ = local_1c0;
    auVar102._16_8_ = uStack_1b0;
    auVar102._24_8_ = uStack_1a8;
    auVar313 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar20,auVar102);
    auVar98._8_8_ = uStack_458;
    auVar98._0_8_ = local_460;
    auVar98._16_8_ = uStack_450;
    auVar98._24_8_ = uStack_448;
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar20,auVar98);
    auVar22._4_4_ = (fVar253 + fVar253) * fVar227;
    auVar22._0_4_ = (fVar247 + fVar247) * fVar226;
    auVar22._8_4_ = (fVar254 + fVar254) * fVar245;
    auVar22._12_4_ = (fVar255 + fVar255) * fVar246;
    auVar22._16_4_ = (fVar256 + fVar256) * 0.0;
    auVar22._20_4_ = (fVar257 + fVar257) * 0.0;
    auVar22._24_4_ = (fVar258 + fVar258) * 0.0;
    auVar22._28_4_ = 0;
    auVar132 = vsubps_avx(auVar22,auVar225._0_32_);
    fVar276 = auVar272._28_4_ + 2.0;
    auVar23._4_4_ = (fVar253 + fVar253) * (fVar273 + 2.0);
    auVar23._0_4_ = (fVar247 + fVar247) * (fVar260 + 2.0);
    auVar23._8_4_ = (fVar254 + fVar254) * (fVar274 + 2.0);
    auVar23._12_4_ = (fVar255 + fVar255) * (fVar275 + 2.0);
    auVar23._16_4_ = (fVar256 + fVar256) * 2.0;
    auVar23._20_4_ = (fVar257 + fVar257) * 2.0;
    auVar23._24_4_ = (fVar258 + fVar258) * 2.0;
    auVar23._28_4_ = fVar276;
    auVar24._4_4_ = fVar253 * fVar253 * 3.0;
    auVar24._0_4_ = fVar247 * fVar247 * 3.0;
    auVar24._8_4_ = fVar254 * fVar254 * 3.0;
    auVar24._12_4_ = fVar255 * fVar255 * 3.0;
    auVar24._16_4_ = fVar256 * fVar256 * 3.0;
    auVar24._20_4_ = fVar257 * fVar257 * 3.0;
    auVar24._24_4_ = fVar258 * fVar258 * 3.0;
    auVar24._28_4_ = fVar259;
    auVar133 = vsubps_avx(auVar23,auVar24);
    auVar233 = vsubps_avx(auVar217._0_32_,auVar22);
    auVar25._4_4_ = auVar132._4_4_ * 0.5;
    auVar25._0_4_ = auVar132._0_4_ * 0.5;
    auVar25._8_4_ = auVar132._8_4_ * 0.5;
    auVar25._12_4_ = auVar132._12_4_ * 0.5;
    auVar25._16_4_ = auVar132._16_4_ * 0.5;
    auVar25._20_4_ = auVar132._20_4_ * 0.5;
    auVar25._24_4_ = auVar132._24_4_ * 0.5;
    auVar25._28_4_ = fVar276;
    auVar26._28_4_ = fVar281 + 0.0;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(((fVar246 + fVar246) * (fVar275 + -5.0) + fVar275 * fVar246) * 0.5,
                            CONCAT48(((fVar245 + fVar245) * (fVar274 + -5.0) + fVar274 * fVar245) *
                                     0.5,CONCAT44(((fVar227 + fVar227) * (fVar273 + -5.0) +
                                                  fVar273 * fVar227) * 0.5,
                                                  ((fVar226 + fVar226) * (fVar260 + -5.0) +
                                                  fVar260 * fVar226) * 0.5))));
    auVar27._4_4_ = auVar133._4_4_ * 0.5;
    auVar27._0_4_ = auVar133._0_4_ * 0.5;
    auVar27._8_4_ = auVar133._8_4_ * 0.5;
    auVar27._12_4_ = auVar133._12_4_ * 0.5;
    auVar27._16_4_ = auVar133._16_4_ * 0.5;
    auVar27._20_4_ = auVar133._20_4_ * 0.5;
    fVar276 = auVar133._28_4_;
    auVar27._24_4_ = auVar133._24_4_ * 0.5;
    auVar27._28_4_ = fVar276;
    fVar247 = auVar233._0_4_ * 0.5;
    fVar253 = auVar233._4_4_ * 0.5;
    fVar254 = auVar233._8_4_ * 0.5;
    fVar255 = auVar233._12_4_ * 0.5;
    fVar256 = auVar233._16_4_ * 0.5;
    fVar257 = auVar233._20_4_ * 0.5;
    fVar258 = auVar233._24_4_ * 0.5;
    auVar28._4_4_ = fStack_23c * fVar253;
    auVar28._0_4_ = local_240 * fVar247;
    auVar28._8_4_ = fStack_238 * fVar254;
    auVar28._12_4_ = fStack_234 * fVar255;
    auVar28._16_4_ = fStack_230 * fVar256;
    auVar28._20_4_ = fStack_22c * fVar257;
    auVar28._24_4_ = fStack_228 * fVar258;
    auVar28._28_4_ = fStack_224;
    auVar29._4_4_ = fVar253 * local_500._4_4_;
    auVar29._0_4_ = fVar247 * (float)local_500;
    auVar29._8_4_ = fVar254 * (float)uStack_4f8;
    auVar29._12_4_ = fVar255 * uStack_4f8._4_4_;
    auVar29._16_4_ = fVar256 * (float)uStack_4f0;
    auVar29._20_4_ = fVar257 * uStack_4f0._4_4_;
    auVar29._24_4_ = fVar258 * (float)uStack_4e8;
    auVar29._28_4_ = fVar281;
    auVar30._4_4_ = fVar253 * local_520._4_4_;
    auVar30._0_4_ = fVar247 * (float)local_520;
    auVar30._8_4_ = fVar254 * (float)uStack_518;
    auVar30._12_4_ = fVar255 * uStack_518._4_4_;
    auVar30._16_4_ = fVar256 * (float)uStack_510;
    auVar30._20_4_ = fVar257 * uStack_510._4_4_;
    auVar30._24_4_ = fVar258 * (float)uStack_508;
    auVar30._28_4_ = auVar132._28_4_;
    auVar31._4_4_ = fVar253 * local_540._4_4_;
    auVar31._0_4_ = fVar247 * (float)local_540;
    auVar31._8_4_ = fVar254 * (float)uStack_538;
    auVar31._12_4_ = fVar255 * uStack_538._4_4_;
    auVar31._16_4_ = fVar256 * (float)uStack_530;
    auVar31._20_4_ = fVar257 * uStack_530._4_4_;
    auVar31._24_4_ = fVar258 * (float)uStack_528;
    auVar31._28_4_ = auVar233._28_4_;
    auVar85._4_4_ = uStack_59c;
    auVar85._0_4_ = local_5a0;
    auVar85._8_4_ = uStack_598;
    auVar85._12_4_ = uStack_594;
    auVar85._16_4_ = uStack_590;
    auVar85._20_4_ = uStack_58c;
    auVar85._24_4_ = uStack_588;
    auVar85._28_4_ = uStack_584;
    auVar6 = vfmadd231ps_fma(auVar28,auVar27,auVar85);
    auVar93._8_8_ = uStack_4b8;
    auVar93._0_8_ = local_4c0;
    auVar93._16_8_ = uStack_4b0;
    auVar93._24_8_ = uStack_4a8;
    auVar115 = vfmadd231ps_fma(auVar29,auVar27,auVar93);
    auVar91._8_8_ = uStack_4d8;
    auVar91._0_8_ = local_4e0;
    auVar91._16_8_ = uStack_4d0;
    auVar91._24_8_ = uStack_4c8;
    auVar121 = vfmadd231ps_fma(auVar30,auVar27,auVar91);
    auVar150 = vfmadd231ps_fma(auVar31,auVar27,local_5c0);
    auVar87._4_4_ = uStack_57c;
    auVar87._0_4_ = local_580;
    auVar87._8_4_ = uStack_578;
    auVar87._12_4_ = uStack_574;
    auVar87._16_4_ = uStack_570;
    auVar87._20_4_ = uStack_56c;
    auVar87._24_4_ = uStack_568;
    auVar87._28_4_ = uStack_564;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar26,auVar87);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar26,auVar101);
    auVar97._8_8_ = uStack_478;
    auVar97._0_8_ = local_480;
    auVar97._16_8_ = uStack_470;
    auVar97._24_8_ = uStack_468;
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar26,auVar97);
    auVar95._8_8_ = uStack_498;
    auVar95._0_8_ = local_4a0;
    auVar95._16_8_ = uStack_490;
    auVar95._24_8_ = uStack_488;
    auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar26,auVar95);
    auVar89._4_4_ = uStack_55c;
    auVar89._0_4_ = local_560;
    auVar89._8_4_ = uStack_558;
    auVar89._12_4_ = uStack_554;
    auVar89._16_4_ = uStack_550;
    auVar89._20_4_ = uStack_54c;
    auVar89._24_4_ = uStack_548;
    auVar89._28_4_ = uStack_544;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar25,auVar89);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar25,auVar103);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar25,auVar102);
    auVar99._8_8_ = uStack_458;
    auVar99._0_8_ = local_460;
    auVar99._16_8_ = uStack_450;
    auVar99._24_8_ = uStack_448;
    auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar25,auVar99);
    auVar278._0_4_ = auVar6._0_4_ * fVar113;
    auVar278._4_4_ = auVar6._4_4_ * fVar113;
    auVar278._8_4_ = auVar6._8_4_ * fVar113;
    auVar278._12_4_ = auVar6._12_4_ * fVar113;
    auVar278._16_4_ = fVar113 * 0.0;
    auVar278._20_4_ = fVar113 * 0.0;
    auVar278._24_4_ = fVar113 * 0.0;
    auVar278._28_4_ = 0;
    fVar247 = auVar115._0_4_ * fVar113;
    fVar253 = auVar115._4_4_ * fVar113;
    local_7a0._4_4_ = fVar253;
    local_7a0._0_4_ = fVar247;
    fVar256 = auVar115._8_4_ * fVar113;
    local_7a0._8_4_ = fVar256;
    fVar228 = auVar115._12_4_ * fVar113;
    local_7a0._12_4_ = fVar228;
    local_7a0._16_4_ = fVar113 * 0.0;
    local_7a0._20_4_ = fVar113 * 0.0;
    local_7a0._24_4_ = fVar113 * 0.0;
    local_7a0._28_4_ = fVar259 + fVar259;
    fVar312 = auVar121._0_4_ * fVar113;
    fVar316 = auVar121._4_4_ * fVar113;
    auVar32._4_4_ = fVar316;
    auVar32._0_4_ = fVar312;
    fVar317 = auVar121._8_4_ * fVar113;
    auVar32._8_4_ = fVar317;
    fVar318 = auVar121._12_4_ * fVar113;
    auVar32._12_4_ = fVar318;
    fVar319 = fVar113 * 0.0;
    auVar32._16_4_ = fVar319;
    fVar320 = fVar113 * 0.0;
    auVar32._20_4_ = fVar320;
    fVar321 = fVar113 * 0.0;
    auVar32._24_4_ = fVar321;
    auVar32._28_4_ = 0x3f000000;
    fVar254 = fVar113 * auVar150._0_4_;
    fVar255 = fVar113 * auVar150._4_4_;
    auVar33._4_4_ = fVar255;
    auVar33._0_4_ = fVar254;
    fVar257 = fVar113 * auVar150._8_4_;
    auVar33._8_4_ = fVar257;
    fVar258 = fVar113 * auVar150._12_4_;
    auVar33._12_4_ = fVar258;
    auVar33._16_4_ = fVar113 * 0.0;
    auVar33._20_4_ = fVar113 * 0.0;
    auVar33._24_4_ = fVar113 * 0.0;
    auVar33._28_4_ = fVar276;
    auVar182 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar180));
    local_a00 = vpermps_avx2(_DAT_0205d4a0,auVar127);
    _local_9a0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar313));
    auVar222 = vsubps_avx(auVar182,ZEXT1632(auVar180));
    auVar14 = vsubps_avx(_local_9a0,ZEXT1632(auVar313));
    fVar235 = auVar14._0_4_;
    fVar239 = auVar14._4_4_;
    auVar34._4_4_ = fVar239 * auVar278._4_4_;
    auVar34._0_4_ = fVar235 * auVar278._0_4_;
    fVar240 = auVar14._8_4_;
    auVar34._8_4_ = fVar240 * auVar278._8_4_;
    fVar226 = auVar14._12_4_;
    auVar34._12_4_ = fVar226 * auVar278._12_4_;
    fVar227 = auVar14._16_4_;
    auVar34._16_4_ = fVar227 * auVar278._16_4_;
    fVar245 = auVar14._20_4_;
    auVar34._20_4_ = fVar245 * auVar278._20_4_;
    fVar246 = auVar14._24_4_;
    auVar34._24_4_ = fVar246 * auVar278._24_4_;
    auVar34._28_4_ = local_9a0._28_4_;
    auVar6 = vfmsub231ps_fma(auVar34,auVar32,auVar222);
    auVar131 = vsubps_avx(local_a00,auVar127);
    fVar299 = auVar222._0_4_;
    fVar306 = auVar222._4_4_;
    auVar35._4_4_ = fVar306 * fVar253;
    auVar35._0_4_ = fVar299 * fVar247;
    fVar307 = auVar222._8_4_;
    auVar35._8_4_ = fVar307 * fVar256;
    fVar308 = auVar222._12_4_;
    auVar35._12_4_ = fVar308 * fVar228;
    fVar309 = auVar222._16_4_;
    auVar35._16_4_ = fVar309 * fVar113 * 0.0;
    fVar310 = auVar222._20_4_;
    auVar35._20_4_ = fVar310 * fVar113 * 0.0;
    fVar311 = auVar222._24_4_;
    auVar35._24_4_ = fVar311 * fVar113 * 0.0;
    auVar35._28_4_ = auVar182._28_4_;
    auVar115 = vfmsub231ps_fma(auVar35,auVar278,auVar131);
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar115._12_4_ * auVar115._12_4_,
                                                CONCAT48(auVar115._8_4_ * auVar115._8_4_,
                                                         CONCAT44(auVar115._4_4_ * auVar115._4_4_,
                                                                  auVar115._0_4_ * auVar115._0_4_)))
                                     ),ZEXT1632(auVar6),ZEXT1632(auVar6));
    fVar260 = auVar131._0_4_;
    fVar273 = auVar131._4_4_;
    auVar36._4_4_ = fVar273 * fVar316;
    auVar36._0_4_ = fVar260 * fVar312;
    fVar274 = auVar131._8_4_;
    auVar36._8_4_ = fVar274 * fVar317;
    fVar275 = auVar131._12_4_;
    auVar36._12_4_ = fVar275 * fVar318;
    fVar281 = auVar131._16_4_;
    auVar36._16_4_ = fVar281 * fVar319;
    fVar285 = auVar131._20_4_;
    auVar36._20_4_ = fVar285 * fVar320;
    fVar286 = auVar131._24_4_;
    auVar36._24_4_ = fVar286 * fVar321;
    auVar36._28_4_ = local_a00._28_4_;
    auVar121 = vfmsub231ps_fma(auVar36,local_7a0,auVar14);
    auVar244._0_4_ = fVar235 * fVar235;
    auVar244._4_4_ = fVar239 * fVar239;
    auVar244._8_4_ = fVar240 * fVar240;
    auVar244._12_4_ = fVar226 * fVar226;
    auVar244._16_4_ = fVar227 * fVar227;
    auVar244._20_4_ = fVar245 * fVar245;
    auVar244._24_4_ = fVar246 * fVar246;
    auVar244._28_4_ = 0;
    auVar115 = vfmadd231ps_fma(auVar244,auVar131,auVar131);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar222,auVar222);
    auVar132 = vrcpps_avx(ZEXT1632(auVar115));
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar121),ZEXT1632(auVar121));
    auVar128._8_4_ = 0x3f800000;
    auVar128._0_8_ = &DAT_3f8000003f800000;
    auVar128._12_4_ = 0x3f800000;
    auVar128._16_4_ = 0x3f800000;
    auVar128._20_4_ = 0x3f800000;
    auVar128._24_4_ = 0x3f800000;
    auVar128._28_4_ = 0x3f800000;
    auVar6 = vfnmadd213ps_fma(auVar132,ZEXT1632(auVar115),auVar128);
    auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar132,auVar132);
    auVar231 = vpermps_avx2(_DAT_0205d4a0,auVar278);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,auVar32);
    auVar37._4_4_ = fVar239 * auVar231._4_4_;
    auVar37._0_4_ = fVar235 * auVar231._0_4_;
    auVar37._8_4_ = fVar240 * auVar231._8_4_;
    auVar37._12_4_ = fVar226 * auVar231._12_4_;
    auVar37._16_4_ = fVar227 * auVar231._16_4_;
    auVar37._20_4_ = fVar245 * auVar231._20_4_;
    auVar37._24_4_ = fVar246 * auVar231._24_4_;
    auVar37._28_4_ = auVar132._28_4_;
    auVar150 = vfmsub231ps_fma(auVar37,local_a20,auVar222);
    local_7c0 = vpermps_avx2(_DAT_0205d4a0,local_7a0);
    auVar38._4_4_ = fVar306 * local_7c0._4_4_;
    auVar38._0_4_ = fVar299 * local_7c0._0_4_;
    auVar38._8_4_ = fVar307 * local_7c0._8_4_;
    auVar38._12_4_ = fVar308 * local_7c0._12_4_;
    auVar38._16_4_ = fVar309 * local_7c0._16_4_;
    auVar38._20_4_ = fVar310 * local_7c0._20_4_;
    auVar38._24_4_ = fVar311 * local_7c0._24_4_;
    auVar38._28_4_ = 0;
    auVar241 = vfmsub231ps_fma(auVar38,auVar231,auVar131);
    auVar150 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * auVar241._12_4_,
                                                  CONCAT48(auVar241._8_4_ * auVar241._8_4_,
                                                           CONCAT44(auVar241._4_4_ * auVar241._4_4_,
                                                                    auVar241._0_4_ * auVar241._0_4_)
                                                          ))),ZEXT1632(auVar150),ZEXT1632(auVar150))
    ;
    fVar247 = local_a20._0_4_;
    auVar262._0_4_ = fVar260 * fVar247;
    fVar253 = local_a20._4_4_;
    auVar262._4_4_ = fVar273 * fVar253;
    fVar256 = local_a20._8_4_;
    auVar262._8_4_ = fVar274 * fVar256;
    fVar259 = local_a20._12_4_;
    auVar262._12_4_ = fVar275 * fVar259;
    fVar236 = local_a20._16_4_;
    auVar262._16_4_ = fVar281 * fVar236;
    fVar237 = local_a20._20_4_;
    auVar262._20_4_ = fVar285 * fVar237;
    fVar238 = local_a20._24_4_;
    auVar262._24_4_ = fVar286 * fVar238;
    auVar262._28_4_ = 0;
    auVar241 = vfmsub231ps_fma(auVar262,local_7c0,auVar14);
    auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),ZEXT1632(auVar241),ZEXT1632(auVar241));
    auVar132 = vmaxps_avx(ZEXT1632(CONCAT412(auVar121._12_4_ * auVar6._12_4_,
                                             CONCAT48(auVar121._8_4_ * auVar6._8_4_,
                                                      CONCAT44(auVar121._4_4_ * auVar6._4_4_,
                                                               auVar121._0_4_ * auVar6._0_4_)))),
                          ZEXT1632(CONCAT412(auVar150._12_4_ * auVar6._12_4_,
                                             CONCAT48(auVar150._8_4_ * auVar6._8_4_,
                                                      CONCAT44(auVar150._4_4_ * auVar6._4_4_,
                                                               auVar150._0_4_ * auVar6._0_4_)))));
    auVar263._0_4_ = auVar290._0_4_ + fVar254;
    auVar263._4_4_ = auVar290._4_4_ + fVar255;
    auVar263._8_4_ = auVar290._8_4_ + fVar257;
    auVar263._12_4_ = auVar290._12_4_ + fVar258;
    auVar263._16_4_ = fVar113 * 0.0 + 0.0;
    auVar263._20_4_ = fVar113 * 0.0 + 0.0;
    auVar263._24_4_ = fVar113 * 0.0 + 0.0;
    auVar263._28_4_ = fVar276 + 0.0;
    local_a40 = ZEXT1632(auVar290);
    auVar133 = vsubps_avx(local_a40,auVar33);
    auVar242 = vpermps_avx2(_DAT_0205d4a0,auVar133);
    local_9c0 = vpermps_avx2(_DAT_0205d4a0,local_a40);
    auVar133 = vmaxps_avx(local_a40,auVar263);
    auVar233 = vmaxps_avx(auVar242,local_9c0);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar115));
    auVar233 = vmaxps_avx(auVar133,auVar233);
    uVar109 = auVar133._28_4_;
    fVar276 = auVar13._0_4_;
    fVar113 = auVar13._4_4_;
    fVar254 = auVar13._8_4_;
    fVar255 = auVar13._12_4_;
    fVar257 = auVar13._16_4_;
    fVar258 = auVar13._20_4_;
    fVar228 = auVar13._24_4_;
    auVar232._0_4_ = fVar276 * fVar276 * fVar276 * auVar115._0_4_ * -0.5;
    auVar232._4_4_ = fVar113 * fVar113 * fVar113 * auVar115._4_4_ * -0.5;
    auVar232._8_4_ = fVar254 * fVar254 * fVar254 * auVar115._8_4_ * -0.5;
    auVar232._12_4_ = fVar255 * fVar255 * fVar255 * auVar115._12_4_ * -0.5;
    auVar232._16_4_ = fVar257 * fVar257 * fVar257 * -0.0;
    auVar232._20_4_ = fVar258 * fVar258 * fVar258 * -0.0;
    auVar232._24_4_ = fVar228 * fVar228 * fVar228 * -0.0;
    auVar232._28_4_ = 0;
    auVar154._8_4_ = 0x3fc00000;
    auVar154._0_8_ = 0x3fc000003fc00000;
    auVar154._12_4_ = 0x3fc00000;
    auVar154._16_4_ = 0x3fc00000;
    auVar154._20_4_ = 0x3fc00000;
    auVar154._24_4_ = 0x3fc00000;
    auVar154._28_4_ = 0x3fc00000;
    auVar6 = vfmadd231ps_fma(auVar232,auVar154,auVar13);
    fVar113 = auVar6._0_4_;
    fVar254 = auVar6._4_4_;
    auVar39._4_4_ = fVar273 * fVar254;
    auVar39._0_4_ = fVar260 * fVar113;
    fVar257 = auVar6._8_4_;
    auVar39._8_4_ = fVar274 * fVar257;
    fVar228 = auVar6._12_4_;
    auVar39._12_4_ = fVar275 * fVar228;
    auVar39._16_4_ = fVar281 * 0.0;
    auVar39._20_4_ = fVar285 * 0.0;
    auVar39._24_4_ = fVar286 * 0.0;
    auVar39._28_4_ = uVar109;
    auVar40._4_4_ = fVar141 * fVar239 * fVar254;
    auVar40._0_4_ = fVar141 * fVar235 * fVar113;
    auVar40._8_4_ = fVar141 * fVar240 * fVar257;
    auVar40._12_4_ = fVar141 * fVar226 * fVar228;
    auVar40._16_4_ = fVar141 * fVar227 * 0.0;
    auVar40._20_4_ = fVar141 * fVar245 * 0.0;
    auVar40._24_4_ = fVar141 * fVar246 * 0.0;
    auVar40._28_4_ = auVar14._28_4_;
    auVar6 = vfmadd231ps_fma(auVar40,auVar39,_local_8e0);
    auVar298 = ZEXT864(0) << 0x20;
    auVar300 = ZEXT1632(auVar313);
    auVar133 = vsubps_avx(ZEXT832(0) << 0x20,auVar300);
    auVar284 = ZEXT3264(auVar133);
    fVar274 = auVar133._0_4_;
    fVar275 = auVar133._4_4_;
    auVar41._4_4_ = fVar275 * fVar239 * fVar254;
    auVar41._0_4_ = fVar274 * fVar235 * fVar113;
    fVar281 = auVar133._8_4_;
    auVar41._8_4_ = fVar281 * fVar240 * fVar257;
    fVar285 = auVar133._12_4_;
    auVar41._12_4_ = fVar285 * fVar226 * fVar228;
    fVar286 = auVar133._16_4_;
    auVar41._16_4_ = fVar286 * fVar227 * 0.0;
    fVar287 = auVar133._20_4_;
    auVar41._20_4_ = fVar287 * fVar245 * 0.0;
    fVar288 = auVar133._24_4_;
    auVar41._24_4_ = fVar288 * fVar246 * 0.0;
    auVar41._28_4_ = auVar231._28_4_;
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar127);
    auVar313 = vfmadd231ps_fma(auVar41,auVar13,auVar39);
    auVar42._4_4_ = fVar306 * fVar254;
    auVar42._0_4_ = fVar299 * fVar113;
    auVar42._8_4_ = fVar307 * fVar257;
    auVar42._12_4_ = fVar308 * fVar228;
    auVar42._16_4_ = fVar309 * 0.0;
    auVar42._20_4_ = fVar310 * 0.0;
    auVar42._24_4_ = fVar311 * 0.0;
    auVar42._28_4_ = uVar109;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar42,auVar183);
    auVar184 = ZEXT1632(auVar180);
    auVar251 = ZEXT832(0) << 0x20;
    auVar15 = vsubps_avx(auVar251,auVar184);
    auVar313 = vfmadd231ps_fma(ZEXT1632(auVar313),auVar15,auVar42);
    auVar43._4_4_ = fVar141 * fVar275;
    auVar43._0_4_ = fVar141 * fVar274;
    auVar43._8_4_ = fVar141 * fVar281;
    auVar43._12_4_ = fVar141 * fVar285;
    auVar43._16_4_ = fVar141 * fVar286;
    auVar43._20_4_ = fVar141 * fVar287;
    auVar43._24_4_ = fVar141 * fVar288;
    auVar43._28_4_ = uVar109;
    auVar290 = vfmadd231ps_fma(auVar43,_local_8e0,auVar13);
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar183,auVar15);
    fVar276 = auVar313._0_4_;
    fVar245 = auVar6._0_4_;
    fVar255 = auVar313._4_4_;
    fVar246 = auVar6._4_4_;
    fVar258 = auVar313._8_4_;
    fVar260 = auVar6._8_4_;
    fVar235 = auVar313._12_4_;
    fVar273 = auVar6._12_4_;
    auVar44._28_4_ = local_8e0._28_4_;
    auVar44._0_28_ =
         ZEXT1628(CONCAT412(fVar273 * fVar235,
                            CONCAT48(fVar260 * fVar258,CONCAT44(fVar246 * fVar255,fVar245 * fVar276)
                                    )));
    auVar153 = vsubps_avx(ZEXT1632(auVar290),auVar44);
    auVar45._4_4_ = fVar275 * fVar275;
    auVar45._0_4_ = fVar274 * fVar274;
    auVar45._8_4_ = fVar281 * fVar281;
    auVar45._12_4_ = fVar285 * fVar285;
    auVar45._16_4_ = fVar286 * fVar286;
    auVar45._20_4_ = fVar287 * fVar287;
    auVar45._24_4_ = fVar288 * fVar288;
    auVar45._28_4_ = local_8e0._28_4_;
    auVar290 = vfmadd231ps_fma(auVar45,auVar13,auVar13);
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar15,auVar15);
    auVar272 = ZEXT1664(auVar290);
    auVar46._28_4_ = auVar222._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar235 * fVar235,
                            CONCAT48(fVar258 * fVar258,CONCAT44(fVar255 * fVar255,fVar276 * fVar276)
                                    )));
    auVar305 = ZEXT3264(auVar46);
    local_7e0 = vsubps_avx(ZEXT1632(auVar290),auVar46);
    auVar133 = vsqrtps_avx(auVar132);
    fVar227 = auVar133._28_4_ + auVar233._28_4_;
    fVar276 = (auVar133._0_4_ + auVar233._0_4_) * 1.0000002;
    fVar255 = (auVar133._4_4_ + auVar233._4_4_) * 1.0000002;
    fVar258 = (auVar133._8_4_ + auVar233._8_4_) * 1.0000002;
    fVar235 = (auVar133._12_4_ + auVar233._12_4_) * 1.0000002;
    fVar239 = (auVar133._16_4_ + auVar233._16_4_) * 1.0000002;
    fVar240 = (auVar133._20_4_ + auVar233._20_4_) * 1.0000002;
    fVar226 = (auVar133._24_4_ + auVar233._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar255 * fVar255;
    auVar47._0_4_ = fVar276 * fVar276;
    auVar47._8_4_ = fVar258 * fVar258;
    auVar47._12_4_ = fVar235 * fVar235;
    auVar47._16_4_ = fVar239 * fVar239;
    auVar47._20_4_ = fVar240 * fVar240;
    auVar47._24_4_ = fVar226 * fVar226;
    auVar47._28_4_ = fVar227;
    local_2a0._0_4_ = auVar153._0_4_ + auVar153._0_4_;
    local_2a0._4_4_ = auVar153._4_4_ + auVar153._4_4_;
    local_2a0._8_4_ = auVar153._8_4_ + auVar153._8_4_;
    local_2a0._12_4_ = auVar153._12_4_ + auVar153._12_4_;
    local_2a0._16_4_ = auVar153._16_4_ + auVar153._16_4_;
    local_2a0._20_4_ = auVar153._20_4_ + auVar153._20_4_;
    local_2a0._24_4_ = auVar153._24_4_ + auVar153._24_4_;
    fVar276 = auVar153._28_4_;
    local_2a0._28_4_ = fVar276 + fVar276;
    auVar233 = vsubps_avx(local_7e0,auVar47);
    auVar277 = ZEXT1632(auVar6);
    auVar48._28_4_ = fVar141;
    auVar48._0_28_ =
         ZEXT1628(CONCAT412(fVar273 * fVar273,
                            CONCAT48(fVar260 * fVar260,CONCAT44(fVar246 * fVar246,fVar245 * fVar245)
                                    )));
    auVar153 = vsubps_avx(local_200,auVar48);
    local_800._4_4_ = local_2a0._4_4_ * local_2a0._4_4_;
    local_800._0_4_ = local_2a0._0_4_ * local_2a0._0_4_;
    local_800._8_4_ = local_2a0._8_4_ * local_2a0._8_4_;
    local_800._12_4_ = local_2a0._12_4_ * local_2a0._12_4_;
    local_800._16_4_ = local_2a0._16_4_ * local_2a0._16_4_;
    local_800._20_4_ = local_2a0._20_4_ * local_2a0._20_4_;
    local_800._24_4_ = local_2a0._24_4_ * local_2a0._24_4_;
    local_800._28_4_ = fVar227;
    fVar255 = auVar153._0_4_;
    fVar258 = auVar153._4_4_;
    fVar235 = auVar153._8_4_;
    fStack_838 = fVar235 * 4.0;
    fVar239 = auVar153._12_4_;
    fStack_834 = fVar239 * 4.0;
    fVar240 = auVar153._16_4_;
    fStack_830 = fVar240 * 4.0;
    fVar226 = auVar153._20_4_;
    fStack_82c = fVar226 * 4.0;
    fVar227 = auVar153._24_4_;
    fStack_828 = fVar227 * 4.0;
    uStack_824 = 0x40800000;
    auVar49._4_4_ = fVar258 * 4.0 * auVar233._4_4_;
    auVar49._0_4_ = fVar255 * 4.0 * auVar233._0_4_;
    auVar49._8_4_ = fStack_838 * auVar233._8_4_;
    auVar49._12_4_ = fStack_834 * auVar233._12_4_;
    auVar49._16_4_ = fStack_830 * auVar233._16_4_;
    auVar49._20_4_ = fStack_82c * auVar233._20_4_;
    auVar49._24_4_ = fStack_828 * auVar233._24_4_;
    auVar49._28_4_ = fVar276;
    auVar268 = vsubps_avx(local_800,auVar49);
    auVar132 = vcmpps_avx(auVar268,auVar251,5);
    auVar261 = ZEXT1632(auVar313);
    fVar276 = auVar153._28_4_;
    if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0x7f,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar132 >> 0xbf,0) == '\0') &&
        (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar132[0x1f])
    {
      local_ca0._8_4_ = 0x7f800000;
      local_ca0._0_8_ = 0x7f8000007f800000;
      local_ca0._12_4_ = 0x7f800000;
      local_ca0._16_4_ = 0x7f800000;
      local_ca0._20_4_ = 0x7f800000;
      local_ca0._24_4_ = 0x7f800000;
      local_ca0._28_4_ = 0x7f800000;
      auVar212._8_4_ = 0xff800000;
      auVar212._0_8_ = 0xff800000ff800000;
      auVar212._12_4_ = 0xff800000;
      auVar212._16_4_ = 0xff800000;
      auVar212._20_4_ = 0xff800000;
      auVar212._24_4_ = 0xff800000;
      auVar212._28_4_ = 0xff800000;
    }
    else {
      auVar251 = vcmpps_avx(auVar268,auVar251,5);
      auVar272 = ZEXT3264(auVar251);
      auVar314 = vsqrtps_avx(auVar268);
      auVar301._0_4_ = fVar255 + fVar255;
      auVar301._4_4_ = fVar258 + fVar258;
      auVar301._8_4_ = fVar235 + fVar235;
      auVar301._12_4_ = fVar239 + fVar239;
      auVar301._16_4_ = fVar240 + fVar240;
      auVar301._20_4_ = fVar226 + fVar226;
      auVar301._24_4_ = fVar227 + fVar227;
      auVar301._28_4_ = fVar276 + fVar276;
      auVar268 = vrcpps_avx(auVar301);
      auVar155._8_4_ = 0x3f800000;
      auVar155._0_8_ = &DAT_3f8000003f800000;
      auVar155._12_4_ = 0x3f800000;
      auVar155._16_4_ = 0x3f800000;
      auVar155._20_4_ = 0x3f800000;
      auVar155._24_4_ = 0x3f800000;
      auVar155._28_4_ = 0x3f800000;
      auVar6 = vfnmadd213ps_fma(auVar301,auVar268,auVar155);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar268,auVar268);
      auVar293._0_4_ = (uint)local_2a0._0_4_ ^ local_760;
      auVar293._4_4_ = (uint)local_2a0._4_4_ ^ uStack_75c;
      auVar293._8_4_ = (uint)local_2a0._8_4_ ^ uStack_758;
      auVar293._12_4_ = (uint)local_2a0._12_4_ ^ uStack_754;
      auVar293._16_4_ = (uint)local_2a0._16_4_ ^ (uint)fStack_750;
      auVar293._20_4_ = (uint)local_2a0._20_4_ ^ (uint)fStack_74c;
      auVar293._24_4_ = (uint)local_2a0._24_4_ ^ (uint)fStack_748;
      auVar293._28_4_ = (uint)local_2a0._28_4_ ^ uStack_744;
      auVar268 = vsubps_avx(auVar293,auVar314);
      auVar50._4_4_ = auVar268._4_4_ * auVar6._4_4_;
      auVar50._0_4_ = auVar268._0_4_ * auVar6._0_4_;
      auVar50._8_4_ = auVar268._8_4_ * auVar6._8_4_;
      auVar50._12_4_ = auVar268._12_4_ * auVar6._12_4_;
      auVar50._16_4_ = auVar268._16_4_ * 0.0;
      auVar50._20_4_ = auVar268._20_4_ * 0.0;
      auVar50._24_4_ = auVar268._24_4_ * 0.0;
      auVar50._28_4_ = auVar268._28_4_;
      auVar268 = vsubps_avx(auVar314,local_2a0);
      auVar51._4_4_ = auVar6._4_4_ * auVar268._4_4_;
      auVar51._0_4_ = auVar6._0_4_ * auVar268._0_4_;
      auVar51._8_4_ = auVar6._8_4_ * auVar268._8_4_;
      auVar51._12_4_ = auVar6._12_4_ * auVar268._12_4_;
      auVar51._16_4_ = auVar268._16_4_ * 0.0;
      auVar51._20_4_ = auVar268._20_4_ * 0.0;
      auVar51._24_4_ = auVar268._24_4_ * 0.0;
      auVar51._28_4_ = auVar268._28_4_;
      auVar6 = vfmadd213ps_fma(auVar277,auVar50,auVar261);
      local_680 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar228,
                                     CONCAT48(auVar6._8_4_ * fVar257,
                                              CONCAT44(auVar6._4_4_ * fVar254,auVar6._0_4_ * fVar113
                                                      ))));
      auVar6 = vfmadd213ps_fma(auVar277,auVar51,auVar261);
      local_6a0 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar228,
                                     CONCAT48(auVar6._8_4_ * fVar257,
                                              CONCAT44(auVar6._4_4_ * fVar254,auVar6._0_4_ * fVar113
                                                      ))));
      auVar156._8_4_ = 0x7f800000;
      auVar156._0_8_ = 0x7f8000007f800000;
      auVar156._12_4_ = 0x7f800000;
      auVar156._16_4_ = 0x7f800000;
      auVar156._20_4_ = 0x7f800000;
      auVar156._24_4_ = 0x7f800000;
      auVar156._28_4_ = 0x7f800000;
      local_ca0 = vblendvps_avx(auVar156,auVar50,auVar251);
      auVar268 = vandps_avx(auVar48,local_900);
      auVar268 = vmaxps_avx(local_5e0,auVar268);
      auVar52._4_4_ = auVar268._4_4_ * 1.9073486e-06;
      auVar52._0_4_ = auVar268._0_4_ * 1.9073486e-06;
      auVar52._8_4_ = auVar268._8_4_ * 1.9073486e-06;
      auVar52._12_4_ = auVar268._12_4_ * 1.9073486e-06;
      auVar52._16_4_ = auVar268._16_4_ * 1.9073486e-06;
      auVar52._20_4_ = auVar268._20_4_ * 1.9073486e-06;
      auVar52._24_4_ = auVar268._24_4_ * 1.9073486e-06;
      auVar52._28_4_ = auVar268._28_4_;
      auVar298 = ZEXT3264(auVar52);
      auVar268 = vandps_avx(local_900,auVar153);
      auVar268 = vcmpps_avx(auVar268,auVar52,1);
      auVar305 = ZEXT3264(auVar268);
      auVar157._8_4_ = 0xff800000;
      auVar157._0_8_ = 0xff800000ff800000;
      auVar157._12_4_ = 0xff800000;
      auVar157._16_4_ = 0xff800000;
      auVar157._20_4_ = 0xff800000;
      auVar157._24_4_ = 0xff800000;
      auVar157._28_4_ = 0xff800000;
      auVar212 = vblendvps_avx(auVar157,auVar51,auVar251);
      auVar314 = auVar251 & auVar268;
      if ((((((((auVar314 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar314 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar314 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar314 >> 0x7f,0) != '\0') ||
            (auVar314 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar314 >> 0xbf,0) != '\0') ||
          (auVar314 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar314[0x1f] < '\0') {
        auVar132 = vandps_avx(auVar268,auVar251);
        auVar268 = vcmpps_avx(auVar233,_DAT_02020f00,2);
        auVar170._8_4_ = 0xff800000;
        auVar170._0_8_ = 0xff800000ff800000;
        auVar170._12_4_ = 0xff800000;
        auVar170._16_4_ = 0xff800000;
        auVar170._20_4_ = 0xff800000;
        auVar170._24_4_ = 0xff800000;
        auVar170._28_4_ = 0xff800000;
        auVar192._8_4_ = 0x7f800000;
        auVar192._0_8_ = 0x7f8000007f800000;
        auVar192._12_4_ = 0x7f800000;
        auVar192._16_4_ = 0x7f800000;
        auVar192._20_4_ = 0x7f800000;
        auVar192._24_4_ = 0x7f800000;
        auVar192._28_4_ = 0x7f800000;
        auVar233 = vblendvps_avx(auVar192,auVar170,auVar268);
        auVar6 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
        auVar314 = vpmovsxwd_avx2(auVar6);
        auVar298 = ZEXT3264(auVar314);
        local_ca0 = vblendvps_avx(local_ca0,auVar233,auVar314);
        auVar233 = vblendvps_avx(auVar170,auVar192,auVar268);
        auVar305 = ZEXT3264(auVar233);
        auVar212 = vblendvps_avx(auVar212,auVar233,auVar314);
        auVar224._0_8_ = auVar132._0_8_ ^ 0xffffffffffffffff;
        auVar224._8_4_ = auVar132._8_4_ ^ 0xffffffff;
        auVar224._12_4_ = auVar132._12_4_ ^ 0xffffffff;
        auVar224._16_4_ = auVar132._16_4_ ^ 0xffffffff;
        auVar224._20_4_ = auVar132._20_4_ ^ 0xffffffff;
        auVar224._24_4_ = auVar132._24_4_ ^ 0xffffffff;
        auVar224._28_4_ = auVar132._28_4_ ^ 0xffffffff;
        auVar132 = vorps_avx(auVar268,auVar224);
        auVar132 = vandps_avx(auVar251,auVar132);
      }
    }
    auVar233 = local_220 & auVar132;
    if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar233 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar233 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar233 >> 0x7f,0) == '\0') &&
          (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar233 >> 0xbf,0) == '\0') &&
        (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar233[0x1f])
    {
LAB_0189f4ff:
      auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      fVar245 = *(float *)(ray + k * 4 + 0x100) - (float)local_950._0_4_;
      auVar250._4_4_ = fVar245;
      auVar250._0_4_ = fVar245;
      auVar250._8_4_ = fVar245;
      auVar250._12_4_ = fVar245;
      auVar250._16_4_ = fVar245;
      auVar250._20_4_ = fVar245;
      auVar250._24_4_ = fVar245;
      auVar250._28_4_ = fVar245;
      auVar268 = vminps_avx(auVar250,auVar212);
      auVar53._4_4_ = fVar275 * fVar316;
      auVar53._0_4_ = fVar274 * fVar312;
      auVar53._8_4_ = fVar281 * fVar317;
      auVar53._12_4_ = fVar285 * fVar318;
      auVar53._16_4_ = fVar286 * fVar319;
      auVar53._20_4_ = fVar287 * fVar320;
      auVar53._24_4_ = fVar288 * fVar321;
      auVar53._28_4_ = fVar245;
      auVar6 = vfmadd213ps_fma(auVar13,local_7a0,auVar53);
      auVar313 = vfmadd213ps_fma(auVar15,auVar278,ZEXT1632(auVar6));
      auVar54._4_4_ = fVar141 * fVar316;
      auVar54._0_4_ = fVar141 * fVar312;
      auVar54._8_4_ = fVar141 * fVar317;
      auVar54._12_4_ = fVar141 * fVar318;
      auVar54._16_4_ = fVar141 * fVar319;
      auVar54._20_4_ = fVar141 * fVar320;
      auVar54._24_4_ = fVar141 * fVar321;
      auVar54._28_4_ = fVar245;
      auVar6 = vfmadd231ps_fma(auVar54,_local_8e0,local_7a0);
      auVar290 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar183,auVar278);
      auVar233 = vandps_avx(ZEXT1632(auVar290),local_900);
      auVar264._8_4_ = 0x219392ef;
      auVar264._0_8_ = 0x219392ef219392ef;
      auVar264._12_4_ = 0x219392ef;
      auVar264._16_4_ = 0x219392ef;
      auVar264._20_4_ = 0x219392ef;
      auVar264._24_4_ = 0x219392ef;
      auVar264._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar233,auVar264,1);
      auVar233 = vrcpps_avx(ZEXT1632(auVar290));
      auVar302._8_4_ = 0x3f800000;
      auVar302._0_8_ = &DAT_3f8000003f800000;
      auVar302._12_4_ = 0x3f800000;
      auVar302._16_4_ = 0x3f800000;
      auVar302._20_4_ = 0x3f800000;
      auVar302._24_4_ = 0x3f800000;
      auVar302._28_4_ = 0x3f800000;
      auVar251 = ZEXT1632(auVar290);
      auVar6 = vfnmadd213ps_fma(auVar233,auVar251,auVar302);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar233,auVar233);
      auVar283._0_4_ = auVar290._0_4_ ^ local_760;
      auVar283._4_4_ = auVar290._4_4_ ^ uStack_75c;
      auVar283._8_4_ = auVar290._8_4_ ^ uStack_758;
      auVar283._12_4_ = auVar290._12_4_ ^ uStack_754;
      auVar283._16_4_ = fStack_750;
      auVar283._20_4_ = fStack_74c;
      auVar283._24_4_ = fStack_748;
      auVar283._28_4_ = uStack_744;
      auVar294._0_4_ = auVar6._0_4_ * (float)(auVar313._0_4_ ^ local_760);
      auVar294._4_4_ = auVar6._4_4_ * (float)(auVar313._4_4_ ^ uStack_75c);
      auVar294._8_4_ = auVar6._8_4_ * (float)(auVar313._8_4_ ^ uStack_758);
      auVar294._12_4_ = auVar6._12_4_ * (float)(auVar313._12_4_ ^ uStack_754);
      auVar294._16_4_ = fStack_750 * 0.0;
      auVar294._20_4_ = fStack_74c * 0.0;
      auVar294._24_4_ = fStack_748 * 0.0;
      auVar294._28_4_ = 0;
      auVar233 = vcmpps_avx(auVar251,auVar283,1);
      auVar233 = vorps_avx(auVar13,auVar233);
      auVar303._8_4_ = 0xff800000;
      auVar303._0_8_ = 0xff800000ff800000;
      auVar303._12_4_ = 0xff800000;
      auVar303._16_4_ = 0xff800000;
      auVar303._20_4_ = 0xff800000;
      auVar303._24_4_ = 0xff800000;
      auVar303._28_4_ = 0xff800000;
      auVar233 = vblendvps_avx(auVar294,auVar303,auVar233);
      auVar100._4_4_ = fStack_25c;
      auVar100._0_4_ = local_260;
      auVar100._8_4_ = fStack_258;
      auVar100._12_4_ = fStack_254;
      auVar100._16_4_ = fStack_250;
      auVar100._20_4_ = fStack_24c;
      auVar100._24_4_ = fStack_248;
      auVar100._28_4_ = fStack_244;
      auVar15 = vmaxps_avx(auVar100,local_ca0);
      auVar15 = vmaxps_avx(auVar15,auVar233);
      auVar233 = vcmpps_avx(auVar251,auVar283,6);
      auVar233 = vorps_avx(auVar13,auVar233);
      auVar265._8_4_ = 0x7f800000;
      auVar265._0_8_ = 0x7f8000007f800000;
      auVar265._12_4_ = 0x7f800000;
      auVar265._16_4_ = 0x7f800000;
      auVar265._20_4_ = 0x7f800000;
      auVar265._24_4_ = 0x7f800000;
      auVar265._28_4_ = 0x7f800000;
      auVar233 = vblendvps_avx(auVar294,auVar265,auVar233);
      auVar268 = vminps_avx(auVar268,auVar233);
      auVar233 = vsubps_avx(ZEXT832(0) << 0x20,local_a00);
      auVar13 = vsubps_avx(ZEXT832(0) << 0x20,_local_9a0);
      auVar55._4_4_ = auVar13._4_4_ * fVar253;
      auVar55._0_4_ = auVar13._0_4_ * fVar247;
      auVar55._8_4_ = auVar13._8_4_ * fVar256;
      auVar55._12_4_ = auVar13._12_4_ * fVar259;
      auVar55._16_4_ = auVar13._16_4_ * fVar236;
      auVar55._20_4_ = auVar13._20_4_ * fVar237;
      auVar55._24_4_ = auVar13._24_4_ * fVar238;
      auVar55._28_4_ = auVar13._28_4_;
      auVar6 = vfnmsub231ps_fma(auVar55,local_7c0,auVar233);
      auVar233 = vsubps_avx(ZEXT832(0) << 0x20,auVar182);
      auVar313 = vfnmadd231ps_fma(ZEXT1632(auVar6),auVar231,auVar233);
      auVar56._4_4_ = fVar141 * fVar253;
      auVar56._0_4_ = fVar141 * fVar247;
      auVar56._8_4_ = fVar141 * fVar256;
      auVar56._12_4_ = fVar141 * fVar259;
      auVar56._16_4_ = fVar141 * fVar236;
      auVar56._20_4_ = fVar141 * fVar237;
      auVar56._24_4_ = fVar141 * fVar238;
      auVar56._28_4_ = auVar233._28_4_;
      auVar6 = vfnmsub231ps_fma(auVar56,local_7c0,_local_8e0);
      auVar290 = vfnmadd231ps_fma(ZEXT1632(auVar6),auVar183,auVar231);
      auVar279._8_4_ = 0x3f800000;
      auVar279._0_8_ = &DAT_3f8000003f800000;
      auVar279._12_4_ = 0x3f800000;
      auVar279._16_4_ = 0x3f800000;
      auVar279._20_4_ = 0x3f800000;
      auVar279._24_4_ = 0x3f800000;
      auVar279._28_4_ = 0x3f800000;
      auVar233 = vandps_avx(ZEXT1632(auVar290),local_900);
      auVar182 = vrcpps_avx(ZEXT1632(auVar290));
      auVar213._8_4_ = 0x219392ef;
      auVar213._0_8_ = 0x219392ef219392ef;
      auVar213._12_4_ = 0x219392ef;
      auVar213._16_4_ = 0x219392ef;
      auVar213._20_4_ = 0x219392ef;
      auVar213._24_4_ = 0x219392ef;
      auVar213._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar233,auVar213,1);
      auVar284 = ZEXT3264(auVar13);
      auVar231 = ZEXT1632(auVar290);
      auVar6 = vfnmadd213ps_fma(auVar182,auVar231,auVar279);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar182,auVar182);
      auVar295._0_4_ = auVar290._0_4_ ^ local_760;
      auVar295._4_4_ = auVar290._4_4_ ^ uStack_75c;
      auVar295._8_4_ = auVar290._8_4_ ^ uStack_758;
      auVar295._12_4_ = auVar290._12_4_ ^ uStack_754;
      auVar295._16_4_ = fStack_750;
      auVar295._20_4_ = fStack_74c;
      auVar295._24_4_ = fStack_748;
      auVar295._28_4_ = uStack_744;
      auVar298 = ZEXT3264(auVar295);
      auVar57._4_4_ = auVar6._4_4_ * (float)(auVar313._4_4_ ^ uStack_75c);
      auVar57._0_4_ = auVar6._0_4_ * (float)(auVar313._0_4_ ^ local_760);
      auVar57._8_4_ = auVar6._8_4_ * (float)(auVar313._8_4_ ^ uStack_758);
      auVar57._12_4_ = auVar6._12_4_ * (float)(auVar313._12_4_ ^ uStack_754);
      auVar57._16_4_ = fStack_750 * 0.0;
      auVar57._20_4_ = fStack_74c * 0.0;
      auVar57._24_4_ = fStack_748 * 0.0;
      auVar57._28_4_ = uStack_744;
      auVar272 = ZEXT3264(auVar57);
      auVar233 = vcmpps_avx(auVar231,auVar295,1);
      auVar233 = vorps_avx(auVar13,auVar233);
      auVar158._8_4_ = 0xff800000;
      auVar158._0_8_ = 0xff800000ff800000;
      auVar158._12_4_ = 0xff800000;
      auVar158._16_4_ = 0xff800000;
      auVar158._20_4_ = 0xff800000;
      auVar158._24_4_ = 0xff800000;
      auVar158._28_4_ = 0xff800000;
      auVar233 = vblendvps_avx(auVar57,auVar158,auVar233);
      auVar305 = ZEXT3264(auVar233);
      _local_8c0 = vmaxps_avx(auVar15,auVar233);
      auVar233 = vcmpps_avx(auVar231,auVar295,6);
      auVar233 = vorps_avx(auVar13,auVar233);
      auVar214._8_4_ = 0x7f800000;
      auVar214._0_8_ = 0x7f8000007f800000;
      auVar214._12_4_ = 0x7f800000;
      auVar214._16_4_ = 0x7f800000;
      auVar214._20_4_ = 0x7f800000;
      auVar214._24_4_ = 0x7f800000;
      auVar214._28_4_ = 0x7f800000;
      auVar233 = vblendvps_avx(auVar57,auVar214,auVar233);
      auVar132 = vandps_avx(auVar132,local_220);
      local_2c0 = vminps_avx(auVar268,auVar233);
      auVar233 = vcmpps_avx(_local_8c0,local_2c0,2);
      auVar13 = auVar132 & auVar233;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0x7f,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0xbf,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f])
      {
        auVar225 = ZEXT3264(auVar279);
      }
      else {
        auVar13 = vminps_avx(local_680,auVar279);
        auVar73 = ZEXT412(0);
        auVar298 = ZEXT1264(auVar73) << 0x20;
        auVar13 = vmaxps_avx(auVar13,ZEXT1232(auVar73) << 0x20);
        auVar15 = vminps_avx(local_6a0,auVar279);
        auVar15 = vmaxps_avx(auVar15,ZEXT1232(auVar73) << 0x20);
        auVar59._4_4_ = (auVar13._4_4_ + 1.0) * 0.125;
        auVar59._0_4_ = (auVar13._0_4_ + 0.0) * 0.125;
        auVar59._8_4_ = (auVar13._8_4_ + 2.0) * 0.125;
        auVar59._12_4_ = (auVar13._12_4_ + 3.0) * 0.125;
        auVar59._16_4_ = (auVar13._16_4_ + 4.0) * 0.125;
        auVar59._20_4_ = (auVar13._20_4_ + 5.0) * 0.125;
        auVar59._24_4_ = (auVar13._24_4_ + 6.0) * 0.125;
        auVar59._28_4_ = auVar13._28_4_ + 7.0;
        auVar305 = ZEXT3264(auVar126);
        auVar6 = vfmadd213ps_fma(auVar59,auVar126,auVar243);
        auVar60._4_4_ = (auVar15._4_4_ + 1.0) * 0.125;
        auVar60._0_4_ = (auVar15._0_4_ + 0.0) * 0.125;
        auVar60._8_4_ = (auVar15._8_4_ + 2.0) * 0.125;
        auVar60._12_4_ = (auVar15._12_4_ + 3.0) * 0.125;
        auVar60._16_4_ = (auVar15._16_4_ + 4.0) * 0.125;
        auVar60._20_4_ = (auVar15._20_4_ + 5.0) * 0.125;
        auVar60._24_4_ = (auVar15._24_4_ + 6.0) * 0.125;
        auVar60._28_4_ = auVar15._28_4_ + 7.0;
        auVar313 = vfmadd213ps_fma(auVar60,auVar126,auVar243);
        auVar13 = vminps_avx(local_a40,auVar263);
        auVar15 = vminps_avx(auVar242,local_9c0);
        auVar13 = vminps_avx(auVar13,auVar15);
        auVar13 = vsubps_avx(auVar13,auVar133);
        auVar132 = vandps_avx(auVar233,auVar132);
        local_680 = ZEXT1632(auVar6);
        local_6a0 = ZEXT1632(auVar313);
        auVar61._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar61._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar61._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar61._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar61._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar61._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar61._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar61._28_4_ = auVar13._28_4_;
        auVar233 = vmaxps_avx(ZEXT832(0) << 0x20,auVar61);
        auVar62._4_4_ = auVar233._4_4_ * auVar233._4_4_;
        auVar62._0_4_ = auVar233._0_4_ * auVar233._0_4_;
        auVar62._8_4_ = auVar233._8_4_ * auVar233._8_4_;
        auVar62._12_4_ = auVar233._12_4_ * auVar233._12_4_;
        auVar62._16_4_ = auVar233._16_4_ * auVar233._16_4_;
        auVar62._20_4_ = auVar233._20_4_ * auVar233._20_4_;
        auVar62._24_4_ = auVar233._24_4_ * auVar233._24_4_;
        auVar62._28_4_ = auVar233._28_4_;
        auVar13 = vsubps_avx(local_7e0,auVar62);
        auVar63._4_4_ = auVar13._4_4_ * fVar258 * 4.0;
        auVar63._0_4_ = auVar13._0_4_ * fVar255 * 4.0;
        auVar63._8_4_ = auVar13._8_4_ * fStack_838;
        auVar63._12_4_ = auVar13._12_4_ * fStack_834;
        auVar63._16_4_ = auVar13._16_4_ * fStack_830;
        auVar63._20_4_ = auVar13._20_4_ * fStack_82c;
        auVar63._24_4_ = auVar13._24_4_ * fStack_828;
        auVar63._28_4_ = auVar233._28_4_;
        auVar15 = vsubps_avx(local_800,auVar63);
        auVar284 = ZEXT3264(auVar15);
        auVar268 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_640 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar233 = vcmpps_avx(auVar15,ZEXT1232(auVar73) << 0x20,5);
        if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar233 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar233 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar233 >> 0x7f,0) == '\0') &&
              (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar233 >> 0xbf,0) == '\0') &&
            (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar233[0x1f]) {
          auVar131 = SUB6432(ZEXT864(0),0) << 0x20;
          local_920 = ZEXT832(0) << 0x20;
          auVar217 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar252._8_4_ = 0x7f800000;
          auVar252._0_8_ = 0x7f8000007f800000;
          auVar252._12_4_ = 0x7f800000;
          auVar252._16_4_ = 0x7f800000;
          auVar252._20_4_ = 0x7f800000;
          auVar252._24_4_ = 0x7f800000;
          auVar252._28_4_ = 0x7f800000;
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
          _local_780 = local_920;
        }
        else {
          auVar182 = vsqrtps_avx(auVar15);
          auVar267._0_4_ = fVar255 + fVar255;
          auVar267._4_4_ = fVar258 + fVar258;
          auVar267._8_4_ = fVar235 + fVar235;
          auVar267._12_4_ = fVar239 + fVar239;
          auVar267._16_4_ = fVar240 + fVar240;
          auVar267._20_4_ = fVar226 + fVar226;
          auVar267._24_4_ = fVar227 + fVar227;
          auVar267._28_4_ = fVar276 + fVar276;
          auVar268 = vrcpps_avx(auVar267);
          auVar6 = vfnmadd213ps_fma(auVar267,auVar268,auVar279);
          auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar268,auVar268);
          auVar296._0_4_ = (uint)local_2a0._0_4_ ^ local_760;
          auVar296._4_4_ = (uint)local_2a0._4_4_ ^ uStack_75c;
          auVar296._8_4_ = (uint)local_2a0._8_4_ ^ uStack_758;
          auVar296._12_4_ = (uint)local_2a0._12_4_ ^ uStack_754;
          auVar296._16_4_ = (uint)local_2a0._16_4_ ^ (uint)fStack_750;
          auVar296._20_4_ = (uint)local_2a0._20_4_ ^ (uint)fStack_74c;
          auVar296._24_4_ = (uint)local_2a0._24_4_ ^ (uint)fStack_748;
          auVar296._28_4_ = (uint)local_2a0._28_4_ ^ uStack_744;
          auVar268 = vsubps_avx(auVar296,auVar182);
          auVar231 = vsubps_avx(auVar182,local_2a0);
          fVar276 = auVar268._0_4_ * auVar6._0_4_;
          fVar247 = auVar268._4_4_ * auVar6._4_4_;
          auVar64._4_4_ = fVar247;
          auVar64._0_4_ = fVar276;
          fVar253 = auVar268._8_4_ * auVar6._8_4_;
          auVar64._8_4_ = fVar253;
          fVar255 = auVar268._12_4_ * auVar6._12_4_;
          auVar64._12_4_ = fVar255;
          fVar256 = auVar268._16_4_ * 0.0;
          auVar64._16_4_ = fVar256;
          fVar258 = auVar268._20_4_ * 0.0;
          auVar64._20_4_ = fVar258;
          fVar259 = auVar268._24_4_ * 0.0;
          auVar64._24_4_ = fVar259;
          auVar64._28_4_ = auVar182._28_4_;
          fVar235 = auVar231._0_4_ * auVar6._0_4_;
          fVar236 = auVar231._4_4_ * auVar6._4_4_;
          auVar65._4_4_ = fVar236;
          auVar65._0_4_ = fVar235;
          fVar237 = auVar231._8_4_ * auVar6._8_4_;
          auVar65._8_4_ = fVar237;
          fVar238 = auVar231._12_4_ * auVar6._12_4_;
          auVar65._12_4_ = fVar238;
          fVar239 = auVar231._16_4_ * 0.0;
          auVar65._16_4_ = fVar239;
          fVar240 = auVar231._20_4_ * 0.0;
          auVar65._20_4_ = fVar240;
          fVar226 = auVar231._24_4_ * 0.0;
          auVar65._24_4_ = fVar226;
          auVar65._28_4_ = auVar268._28_4_;
          auVar298 = ZEXT3264(auVar65);
          auVar6 = vfmadd213ps_fma(auVar277,auVar64,auVar261);
          auVar313 = vfmadd213ps_fma(auVar277,auVar65,auVar261);
          auVar268 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar228,
                                        CONCAT48(auVar6._8_4_ * fVar257,
                                                 CONCAT44(auVar6._4_4_ * fVar254,
                                                          auVar6._0_4_ * fVar113))));
          auVar66._28_4_ = 0x3f800000;
          auVar66._0_28_ =
               ZEXT1628(CONCAT412(auVar313._12_4_ * fVar228,
                                  CONCAT48(auVar313._8_4_ * fVar257,
                                           CONCAT44(auVar313._4_4_ * fVar254,
                                                    auVar313._0_4_ * fVar113))));
          auVar6 = vfmadd213ps_fma(auVar222,auVar268,auVar184);
          auVar313 = vfmadd213ps_fma(auVar222,auVar66,auVar184);
          auVar290 = vfmadd213ps_fma(auVar131,auVar268,auVar127);
          auVar115 = vfmadd213ps_fma(auVar131,auVar66,auVar127);
          auVar180 = vfmadd213ps_fma(auVar268,auVar14,auVar300);
          auVar121 = vfmadd213ps_fma(auVar14,auVar66,auVar300);
          auVar67._4_4_ = fVar112 * fVar247;
          auVar67._0_4_ = fVar112 * fVar276;
          auVar67._8_4_ = fVar112 * fVar253;
          auVar67._12_4_ = fVar112 * fVar255;
          auVar67._16_4_ = fVar112 * fVar256;
          auVar67._20_4_ = fVar112 * fVar258;
          auVar67._24_4_ = fVar112 * fVar259;
          auVar67._28_4_ = 0;
          auVar131 = vsubps_avx(auVar67,ZEXT1632(auVar6));
          auVar68._4_4_ = (float)local_8e0._4_4_ * fVar247;
          auVar68._0_4_ = (float)local_8e0._0_4_ * fVar276;
          auVar68._8_4_ = fStack_8d8 * fVar253;
          auVar68._12_4_ = fStack_8d4 * fVar255;
          auVar68._16_4_ = fStack_8d0 * fVar256;
          auVar68._20_4_ = fStack_8cc * fVar258;
          auVar68._24_4_ = fStack_8c8 * fVar259;
          auVar68._28_4_ = 0;
          auVar268 = vsubps_avx(auVar68,ZEXT1632(auVar290));
          auVar186._0_4_ = fVar141 * fVar276;
          auVar186._4_4_ = fVar141 * fVar247;
          auVar186._8_4_ = fVar141 * fVar253;
          auVar186._12_4_ = fVar141 * fVar255;
          auVar186._16_4_ = fVar141 * fVar256;
          auVar186._20_4_ = fVar141 * fVar258;
          auVar186._24_4_ = fVar141 * fVar259;
          auVar186._28_4_ = 0;
          auVar222 = vsubps_avx(auVar186,ZEXT1632(auVar180));
          auVar217 = ZEXT3264(auVar222);
          auVar269._0_4_ = fVar112 * fVar235;
          auVar269._4_4_ = fVar112 * fVar236;
          auVar269._8_4_ = fVar112 * fVar237;
          auVar269._12_4_ = fVar112 * fVar238;
          auVar269._16_4_ = fVar112 * fVar239;
          auVar269._20_4_ = fVar112 * fVar240;
          auVar269._24_4_ = fVar112 * fVar226;
          auVar269._28_4_ = 0;
          local_640 = vsubps_avx(auVar269,ZEXT1632(auVar313));
          auVar69._4_4_ = (float)local_8e0._4_4_ * fVar236;
          auVar69._0_4_ = (float)local_8e0._0_4_ * fVar235;
          auVar69._8_4_ = fStack_8d8 * fVar237;
          auVar69._12_4_ = fStack_8d4 * fVar238;
          auVar69._16_4_ = fStack_8d0 * fVar239;
          auVar69._20_4_ = fStack_8cc * fVar240;
          auVar69._24_4_ = fStack_8c8 * fVar226;
          auVar69._28_4_ = local_640._28_4_;
          local_920 = vsubps_avx(auVar69,ZEXT1632(auVar115));
          auVar70._4_4_ = fVar141 * fVar236;
          auVar70._0_4_ = fVar141 * fVar235;
          auVar70._8_4_ = fVar141 * fVar237;
          auVar70._12_4_ = fVar141 * fVar238;
          auVar70._16_4_ = fVar141 * fVar239;
          auVar70._20_4_ = fVar141 * fVar240;
          auVar70._24_4_ = fVar141 * fVar226;
          auVar70._28_4_ = local_920._28_4_;
          _local_780 = vsubps_avx(auVar70,ZEXT1632(auVar121));
          auVar305 = ZEXT864(0) << 0x20;
          auVar14 = vcmpps_avx(auVar15,_DAT_02020f00,5);
          auVar270._8_4_ = 0x7f800000;
          auVar270._0_8_ = 0x7f8000007f800000;
          auVar270._12_4_ = 0x7f800000;
          auVar270._16_4_ = 0x7f800000;
          auVar270._20_4_ = 0x7f800000;
          auVar270._24_4_ = 0x7f800000;
          auVar270._28_4_ = 0x7f800000;
          auVar252 = vblendvps_avx(auVar270,auVar64,auVar14);
          auVar222 = vandps_avx(local_900,auVar48);
          auVar222 = vmaxps_avx(local_5e0,auVar222);
          auVar284 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar71._4_4_ = auVar222._4_4_ * 1.9073486e-06;
          auVar71._0_4_ = auVar222._0_4_ * 1.9073486e-06;
          auVar71._8_4_ = auVar222._8_4_ * 1.9073486e-06;
          auVar71._12_4_ = auVar222._12_4_ * 1.9073486e-06;
          auVar71._16_4_ = auVar222._16_4_ * 1.9073486e-06;
          auVar71._20_4_ = auVar222._20_4_ * 1.9073486e-06;
          auVar71._24_4_ = auVar222._24_4_ * 1.9073486e-06;
          auVar71._28_4_ = auVar222._28_4_;
          auVar222 = vandps_avx(local_900,auVar153);
          auVar222 = vcmpps_avx(auVar222,auVar71,1);
          auVar271._8_4_ = 0xff800000;
          auVar271._0_8_ = 0xff800000ff800000;
          auVar271._12_4_ = 0xff800000;
          auVar271._16_4_ = 0xff800000;
          auVar271._20_4_ = 0xff800000;
          auVar271._24_4_ = 0xff800000;
          auVar271._28_4_ = 0xff800000;
          auVar266 = vblendvps_avx(auVar271,auVar65,auVar14);
          auVar15 = auVar14 & auVar222;
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar15 >> 0x7f,0) != '\0') ||
                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0xbf,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar15[0x1f] < '\0') {
            auVar233 = vandps_avx(auVar222,auVar14);
            auVar222 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,2);
            auVar297._8_4_ = 0xff800000;
            auVar297._0_8_ = 0xff800000ff800000;
            auVar297._12_4_ = 0xff800000;
            auVar297._16_4_ = 0xff800000;
            auVar297._20_4_ = 0xff800000;
            auVar297._24_4_ = 0xff800000;
            auVar297._28_4_ = 0xff800000;
            auVar298 = ZEXT3264(auVar297);
            auVar304._8_4_ = 0x7f800000;
            auVar304._0_8_ = 0x7f8000007f800000;
            auVar304._12_4_ = 0x7f800000;
            auVar304._16_4_ = 0x7f800000;
            auVar304._20_4_ = 0x7f800000;
            auVar304._24_4_ = 0x7f800000;
            auVar304._28_4_ = 0x7f800000;
            auVar305 = ZEXT3264(auVar304);
            auVar13 = vblendvps_avx(auVar304,auVar297,auVar222);
            auVar6 = vpackssdw_avx(auVar233._0_16_,auVar233._16_16_);
            auVar15 = vpmovsxwd_avx2(auVar6);
            auVar252 = vblendvps_avx(auVar252,auVar13,auVar15);
            auVar13 = vblendvps_avx(auVar297,auVar304,auVar222);
            auVar284 = ZEXT3264(auVar13);
            auVar266 = vblendvps_avx(auVar266,auVar13,auVar15);
            auVar234._0_8_ = auVar233._0_8_ ^ 0xffffffffffffffff;
            auVar234._8_4_ = auVar233._8_4_ ^ 0xffffffff;
            auVar234._12_4_ = auVar233._12_4_ ^ 0xffffffff;
            auVar234._16_4_ = auVar233._16_4_ ^ 0xffffffff;
            auVar234._20_4_ = auVar233._20_4_ ^ 0xffffffff;
            auVar234._24_4_ = auVar233._24_4_ ^ 0xffffffff;
            auVar234._28_4_ = auVar233._28_4_ ^ 0xffffffff;
            auVar233 = vorps_avx(auVar222,auVar234);
            auVar233 = vandps_avx(auVar14,auVar233);
          }
        }
        local_440 = _local_8c0;
        local_420 = vminps_avx(local_2c0,auVar252);
        auVar14 = vmaxps_avx(_local_8c0,auVar266);
        auVar272 = ZEXT3264(auVar14);
        _local_2e0 = auVar14;
        auVar13 = vcmpps_avx(_local_8c0,local_420,2);
        auVar13 = vandps_avx(auVar13,auVar132);
        auVar222 = vcmpps_avx(auVar14,local_2c0,2);
        _local_880 = vandps_avx(auVar222,auVar132);
        auVar132 = vorps_avx(_local_880,auVar13);
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar132 >> 0x7f,0) == '\0') &&
              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0xbf,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar132[0x1f]) goto LAB_0189f4ff;
        auVar132 = vpcmpeqd_avx2(auVar132,auVar132);
        local_6e0._0_4_ = auVar233._0_4_ ^ auVar132._0_4_;
        local_6e0._4_4_ = auVar233._4_4_ ^ auVar132._4_4_;
        local_6e0._8_4_ = auVar233._8_4_ ^ auVar132._8_4_;
        local_6e0._12_4_ = auVar233._12_4_ ^ auVar132._12_4_;
        local_6e0._16_4_ = auVar233._16_4_ ^ auVar132._16_4_;
        local_6e0._20_4_ = auVar233._20_4_ ^ auVar132._20_4_;
        local_6e0._24_4_ = auVar233._24_4_ ^ auVar132._24_4_;
        local_6e0._28_4_ = auVar233._28_4_ ^ auVar132._28_4_;
        auVar193._0_4_ = fVar141 * auVar217._0_4_;
        auVar193._4_4_ = fVar141 * auVar217._4_4_;
        auVar193._8_4_ = fVar141 * auVar217._8_4_;
        auVar193._12_4_ = fVar141 * auVar217._12_4_;
        auVar193._16_4_ = fVar141 * auVar217._16_4_;
        auVar193._20_4_ = fVar141 * auVar217._20_4_;
        auVar193._28_36_ = auVar217._28_36_;
        auVar193._24_4_ = fVar141 * auVar217._24_4_;
        auVar6 = vfmadd132ps_fma(auVar268,auVar193._0_32_,_local_8e0);
        auVar6 = vfmadd213ps_fma(auVar131,auVar183,ZEXT1632(auVar6));
        auVar132 = vandps_avx(ZEXT1632(auVar6),local_900);
        auVar160._8_4_ = 0x3e99999a;
        auVar160._0_8_ = 0x3e99999a3e99999a;
        auVar160._12_4_ = 0x3e99999a;
        auVar160._16_4_ = 0x3e99999a;
        auVar160._20_4_ = 0x3e99999a;
        auVar160._24_4_ = 0x3e99999a;
        auVar160._28_4_ = 0x3e99999a;
        auVar132 = vcmpps_avx(auVar132,auVar160,1);
        auVar132 = vorps_avx(auVar132,local_6e0);
        auVar161._8_4_ = 3;
        auVar161._0_8_ = 0x300000003;
        auVar161._12_4_ = 3;
        auVar161._16_4_ = 3;
        auVar161._20_4_ = 3;
        auVar161._24_4_ = 3;
        auVar161._28_4_ = 3;
        auVar187._8_4_ = 2;
        auVar187._0_8_ = 0x200000002;
        auVar187._12_4_ = 2;
        auVar187._16_4_ = 2;
        auVar187._20_4_ = 2;
        auVar187._24_4_ = 2;
        auVar187._28_4_ = 2;
        auVar132 = vblendvps_avx(auVar187,auVar161,auVar132);
        uVar109 = (undefined4)uVar110;
        local_700._4_4_ = uVar109;
        local_700._0_4_ = uVar109;
        local_700._8_4_ = uVar109;
        local_700._12_4_ = uVar109;
        local_700._16_4_ = uVar109;
        local_700._20_4_ = uVar109;
        local_700._24_4_ = uVar109;
        local_700._28_4_ = uVar109;
        local_6c0 = vpcmpgtd_avx2(auVar132,local_700);
        local_720 = vpandn_avx2(local_6c0,auVar13);
        auVar217 = ZEXT3264(local_720);
        auVar132 = auVar13 & ~local_6c0;
        auStack_858 = auVar153._8_24_;
        local_860 = uVar110;
        fStack_b7c = auVar3._4_4_;
        fStack_b78 = auVar3._8_4_;
        fStack_b74 = auVar3._12_4_;
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0x7f,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar132 >> 0xbf,0) != '\0') ||
            (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar132[0x1f] < '\0') {
          auVar313 = vminps_avx(auVar4,auVar5);
          auVar6 = vmaxps_avx(auVar4,auVar5);
          auVar290 = vminps_avx(auVar2,auVar3);
          auVar115 = vminps_avx(auVar313,auVar290);
          auVar313 = vmaxps_avx(auVar2,auVar3);
          auVar290 = vmaxps_avx(auVar6,auVar313);
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar6 = vandps_avx(auVar115,auVar195);
          local_a40 = ZEXT1632(auVar195);
          auVar313 = vandps_avx(auVar290,auVar195);
          auVar6 = vmaxps_avx(auVar6,auVar313);
          auVar313 = vmovshdup_avx(auVar6);
          auVar313 = vmaxss_avx(auVar313,auVar6);
          auVar6 = vshufpd_avx(auVar6,auVar6,1);
          auVar6 = vmaxss_avx(auVar6,auVar313);
          local_a00._0_4_ = auVar6._0_4_ * 1.9073486e-06;
          local_820._0_16_ = vshufps_avx(auVar290,auVar290,0xff);
          local_820._16_16_ = auVar133._16_16_;
          local_8a0._4_4_ = (float)local_8c0._4_4_ + fVar12;
          local_8a0._0_4_ = (float)local_8c0._0_4_ + fVar12;
          fStack_898 = fStack_8b8 + fVar12;
          fStack_894 = fStack_8b4 + fVar12;
          fStack_890 = fStack_8b0 + fVar12;
          fStack_88c = fStack_8ac + fVar12;
          fStack_888 = fStack_8a8 + fVar12;
          fStack_884 = fStack_8a4 + fVar12;
          local_740 = _local_880;
          do {
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar132 = auVar217._0_32_;
            auVar133 = vblendvps_avx(auVar162,_local_8c0,auVar132);
            auVar233 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar233 = vminps_avx(auVar133,auVar233);
            auVar222 = vshufpd_avx(auVar233,auVar233,5);
            auVar233 = vminps_avx(auVar233,auVar222);
            auVar222 = vpermpd_avx2(auVar233,0x4e);
            auVar233 = vminps_avx(auVar233,auVar222);
            auVar133 = vcmpps_avx(auVar133,auVar233,0);
            auVar233 = auVar132 & auVar133;
            if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar233 >> 0x7f,0) != '\0') ||
                  (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar233 >> 0xbf,0) != '\0') ||
                (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar233[0x1f] < '\0') {
              auVar132 = vandps_avx(auVar133,auVar132);
            }
            uVar108 = vmovmskps_avx(auVar132);
            iVar105 = 0;
            for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
              iVar105 = iVar105 + 1;
            }
            uVar108 = iVar105 << 2;
            *(undefined4 *)(local_720 + uVar108) = 0;
            fVar276 = *(float *)(local_680 + uVar108);
            uVar108 = *(uint *)(local_440 + uVar108);
            fVar247 = auVar10._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              fVar247 = sqrtf((float)local_9e0._0_4_);
            }
            auVar284 = ZEXT464(uVar108);
            local_7c0._0_4_ = fVar247 * 1.9073486e-06;
            lVar107 = 5;
            do {
              fVar247 = auVar284._0_4_;
              auVar116._4_4_ = fVar247;
              auVar116._0_4_ = fVar247;
              auVar116._8_4_ = fVar247;
              auVar116._12_4_ = fVar247;
              auVar313 = vfmadd213ps_fma(auVar116,local_9d0,_DAT_01feba10);
              fVar256 = 1.0 - fVar276;
              auVar121 = SUB6416(ZEXT464(0x40400000),0);
              auVar180 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar150 = ZEXT416((uint)fVar276);
              auVar290 = vfmadd213ss_fma(auVar121,auVar150,auVar180);
              auVar6 = vfmadd213ss_fma(auVar290,ZEXT416((uint)(fVar276 * fVar276)),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar115 = vfmadd213ss_fma(auVar121,ZEXT416((uint)fVar256),auVar180);
              auVar115 = vfmadd213ss_fma(auVar115,ZEXT416((uint)(fVar256 * fVar256)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar113 = fVar256 * fVar256 * -fVar276 * 0.5;
              fVar253 = auVar6._0_4_ * 0.5;
              fVar254 = auVar115._0_4_ * 0.5;
              fVar255 = fVar276 * fVar276 * -fVar256 * 0.5;
              auVar196._0_4_ = fVar255 * fVar194;
              auVar196._4_4_ = fVar255 * fStack_b7c;
              auVar196._8_4_ = fVar255 * fStack_b78;
              auVar196._12_4_ = fVar255 * fStack_b74;
              auVar218._4_4_ = fVar254;
              auVar218._0_4_ = fVar254;
              auVar218._8_4_ = fVar254;
              auVar218._12_4_ = fVar254;
              auVar6 = vfmadd132ps_fma(auVar218,auVar196,auVar2);
              auVar173._4_4_ = fVar253;
              auVar173._0_4_ = fVar253;
              auVar173._8_4_ = fVar253;
              auVar173._12_4_ = fVar253;
              auVar6 = vfmadd132ps_fma(auVar173,auVar6,auVar5);
              auVar197._4_4_ = fVar113;
              auVar197._0_4_ = fVar113;
              auVar197._8_4_ = fVar113;
              auVar197._12_4_ = fVar113;
              auVar6 = vfmadd132ps_fma(auVar197,auVar6,auVar4);
              auVar180 = vfmadd231ss_fma(auVar180,auVar150,ZEXT416(0x41100000));
              auVar115 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar150,ZEXT416(0x40800000)
                                        );
              local_7a0._0_16_ = auVar6;
              auVar6 = vsubps_avx(auVar313,auVar6);
              _local_9a0 = auVar6;
              auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
              auVar313 = vfmadd213ss_fma(auVar121,auVar150,ZEXT416(0xbf800000));
              fVar113 = auVar6._0_4_;
              if (fVar113 < 0.0) {
                local_a20._0_4_ = auVar290._0_4_;
                local_9c0._0_4_ = fVar256 * -2.0;
                auVar298._0_4_ = sqrtf(fVar113);
                auVar298._4_60_ = extraout_var;
                auVar290 = ZEXT416((uint)local_a20._0_4_);
                auVar121 = auVar298._0_16_;
                fVar253 = (float)local_9c0._0_4_;
              }
              else {
                auVar121 = vsqrtss_avx(auVar6,auVar6);
                fVar253 = fVar256 * -2.0;
              }
              auVar290 = vfmadd213ss_fma(auVar290,ZEXT416((uint)(fVar276 + fVar276)),
                                         ZEXT416((uint)(fVar276 * fVar276 * 3.0)));
              auVar195 = SUB6416(ZEXT464(0x40000000),0);
              auVar241 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,auVar195);
              auVar282 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * fVar256 * -3.0)),
                                         ZEXT416((uint)(fVar256 + fVar256)),auVar241);
              auVar289 = vfnmadd231ss_fma(ZEXT416((uint)(fVar276 * (fVar256 + fVar256))),
                                          ZEXT416((uint)fVar256),ZEXT416((uint)fVar256));
              auVar241 = vfmadd213ss_fma(ZEXT416((uint)fVar253),auVar150,
                                         ZEXT416((uint)(fVar276 * fVar276)));
              fVar253 = auVar289._0_4_ * 0.5;
              fVar254 = auVar290._0_4_ * 0.5;
              fVar255 = auVar282._0_4_ * 0.5;
              fVar256 = auVar241._0_4_ * 0.5;
              auVar198._0_4_ = fVar194 * fVar256;
              auVar198._4_4_ = fStack_b7c * fVar256;
              auVar198._8_4_ = fStack_b78 * fVar256;
              auVar198._12_4_ = fStack_b74 * fVar256;
              auVar174._4_4_ = fVar255;
              auVar174._0_4_ = fVar255;
              auVar174._8_4_ = fVar255;
              auVar174._12_4_ = fVar255;
              auVar290 = vfmadd213ps_fma(auVar174,auVar2,auVar198);
              auVar142._4_4_ = fVar254;
              auVar142._0_4_ = fVar254;
              auVar142._8_4_ = fVar254;
              auVar142._12_4_ = fVar254;
              auVar290 = vfmadd213ps_fma(auVar142,auVar5,auVar290);
              auVar291._4_4_ = fVar253;
              auVar291._0_4_ = fVar253;
              auVar291._8_4_ = fVar253;
              auVar291._12_4_ = fVar253;
              auVar241 = vfmadd213ps_fma(auVar291,auVar4,auVar290);
              auVar150 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar150,auVar195);
              local_ba0 = auVar313._0_4_;
              auVar117._0_4_ = fVar194 * local_ba0;
              auVar117._4_4_ = fStack_b7c * local_ba0;
              auVar117._8_4_ = fStack_b78 * local_ba0;
              auVar117._12_4_ = fStack_b74 * local_ba0;
              local_ac0 = auVar115._0_4_;
              auVar175._4_4_ = local_ac0;
              auVar175._0_4_ = local_ac0;
              auVar175._8_4_ = local_ac0;
              auVar175._12_4_ = local_ac0;
              auVar313 = vfmadd213ps_fma(auVar175,auVar2,auVar117);
              uVar109 = auVar180._0_4_;
              auVar199._4_4_ = uVar109;
              auVar199._0_4_ = uVar109;
              auVar199._8_4_ = uVar109;
              auVar199._12_4_ = uVar109;
              auVar313 = vfmadd213ps_fma(auVar199,auVar5,auVar313);
              auVar290 = vdpps_avx(auVar241,auVar241,0x7f);
              auVar143._0_4_ = auVar150._0_4_;
              auVar143._4_4_ = auVar143._0_4_;
              auVar143._8_4_ = auVar143._0_4_;
              auVar143._12_4_ = auVar143._0_4_;
              auVar180 = vfmadd213ps_fma(auVar143,auVar4,auVar313);
              auVar313 = vblendps_avx(auVar290,_DAT_01feba10,0xe);
              auVar115 = vrsqrtss_avx(auVar313,auVar313);
              fVar255 = auVar290._0_4_;
              fVar253 = auVar115._0_4_;
              auVar115 = vdpps_avx(auVar241,auVar180,0x7f);
              fVar253 = fVar253 * 1.5 + fVar255 * -0.5 * fVar253 * fVar253 * fVar253;
              auVar144._0_4_ = auVar180._0_4_ * fVar255;
              auVar144._4_4_ = auVar180._4_4_ * fVar255;
              auVar144._8_4_ = auVar180._8_4_ * fVar255;
              auVar144._12_4_ = auVar180._12_4_ * fVar255;
              fVar254 = auVar115._0_4_;
              auVar229._0_4_ = auVar241._0_4_ * fVar254;
              auVar229._4_4_ = auVar241._4_4_ * fVar254;
              fVar256 = auVar241._8_4_;
              auVar229._8_4_ = fVar256 * fVar254;
              fVar257 = auVar241._12_4_;
              auVar229._12_4_ = fVar257 * fVar254;
              auVar115 = vsubps_avx(auVar144,auVar229);
              auVar313 = vrcpss_avx(auVar313,auVar313);
              auVar180 = vfnmadd213ss_fma(auVar313,auVar290,auVar195);
              fVar254 = auVar313._0_4_ * auVar180._0_4_;
              auVar313 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                    ZEXT416((uint)(fVar247 * (float)local_7c0._0_4_)));
              auVar272 = ZEXT1664(auVar313);
              local_a20._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
              local_a20._8_4_ = -fVar256;
              local_a20._12_4_ = -fVar257;
              auVar200._0_4_ = fVar253 * auVar115._0_4_ * fVar254;
              auVar200._4_4_ = fVar253 * auVar115._4_4_ * fVar254;
              auVar200._8_4_ = fVar253 * auVar115._8_4_ * fVar254;
              auVar200._12_4_ = fVar253 * auVar115._12_4_ * fVar254;
              auVar248._0_4_ = auVar241._0_4_ * fVar253;
              auVar248._4_4_ = auVar241._4_4_ * fVar253;
              auVar248._8_4_ = fVar256 * fVar253;
              auVar248._12_4_ = fVar257 * fVar253;
              if (fVar255 < -fVar255) {
                fVar253 = sqrtf(fVar255);
                auVar272 = ZEXT464(auVar313._0_4_);
                auVar121 = ZEXT416(auVar121._0_4_);
              }
              else {
                auVar290 = vsqrtss_avx(auVar290,auVar290);
                fVar253 = auVar290._0_4_;
              }
              auVar290 = vdpps_avx(_local_9a0,auVar248,0x7f);
              auVar282 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar121,auVar272._0_16_);
              auVar115 = vdpps_avx(local_a20._0_16_,auVar248,0x7f);
              auVar180 = vdpps_avx(_local_9a0,auVar200,0x7f);
              auVar150 = vdpps_avx(local_9d0,auVar248,0x7f);
              auVar282 = vfmadd213ss_fma(ZEXT416((uint)(auVar121._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_a00._0_4_ / fVar253)),auVar282)
              ;
              auVar305 = ZEXT1664(auVar282);
              fVar253 = auVar115._0_4_ + auVar180._0_4_;
              auVar118._0_4_ = auVar290._0_4_ * auVar290._0_4_;
              auVar118._4_4_ = auVar290._4_4_ * auVar290._4_4_;
              auVar118._8_4_ = auVar290._8_4_ * auVar290._8_4_;
              auVar118._12_4_ = auVar290._12_4_ * auVar290._12_4_;
              auVar115 = vdpps_avx(_local_9a0,local_a20._0_16_,0x7f);
              auVar121 = vsubps_avx(auVar6,auVar118);
              auVar180 = vrsqrtss_avx(auVar121,auVar121);
              fVar255 = auVar121._0_4_;
              fVar254 = auVar180._0_4_;
              fVar254 = fVar254 * 1.5 + fVar255 * -0.5 * fVar254 * fVar254 * fVar254;
              auVar180 = vdpps_avx(_local_9a0,local_9d0,0x7f);
              local_a20._0_16_ = vfnmadd231ss_fma(auVar115,auVar290,ZEXT416((uint)fVar253));
              auVar115 = vfnmadd231ss_fma(auVar180,auVar290,auVar150);
              if (fVar255 < 0.0) {
                local_9c0._0_16_ = ZEXT416((uint)fVar253);
                local_7e0._0_4_ = fVar254;
                local_800._0_16_ = auVar115;
                fVar255 = sqrtf(fVar255);
                auVar305 = ZEXT464(auVar282._0_4_);
                auVar272 = ZEXT464(auVar313._0_4_);
                fVar254 = (float)local_7e0._0_4_;
                auVar115 = local_800._0_16_;
                auVar313 = local_9c0._0_16_;
              }
              else {
                auVar313 = vsqrtss_avx(auVar121,auVar121);
                fVar255 = auVar313._0_4_;
                auVar313 = ZEXT416((uint)fVar253);
              }
              auVar298 = ZEXT1664(auVar290);
              auVar180 = vpermilps_avx(local_7a0._0_16_,0xff);
              auVar121 = vshufps_avx(auVar241,auVar241,0xff);
              auVar282 = vfmsub213ss_fma(local_a20._0_16_,ZEXT416((uint)fVar254),auVar121);
              auVar201._0_8_ = auVar150._0_8_ ^ 0x8000000080000000;
              auVar201._8_4_ = auVar150._8_4_ ^ 0x80000000;
              auVar201._12_4_ = auVar150._12_4_ ^ 0x80000000;
              auVar219._0_8_ = auVar282._0_8_ ^ 0x8000000080000000;
              auVar219._8_4_ = auVar282._8_4_ ^ 0x80000000;
              auVar219._12_4_ = auVar282._12_4_ ^ 0x80000000;
              auVar115 = ZEXT416((uint)(auVar115._0_4_ * fVar254));
              auVar150 = vfmsub231ss_fma(ZEXT416((uint)(auVar150._0_4_ * auVar282._0_4_)),auVar313,
                                         auVar115);
              auVar115 = vinsertps_avx(auVar115,auVar201,0x10);
              uVar109 = auVar150._0_4_;
              auVar202._4_4_ = uVar109;
              auVar202._0_4_ = uVar109;
              auVar202._8_4_ = uVar109;
              auVar202._12_4_ = uVar109;
              auVar115 = vdivps_avx(auVar115,auVar202);
              auVar150 = ZEXT416((uint)(fVar255 - auVar180._0_4_));
              auVar180 = vinsertps_avx(auVar290,auVar150,0x10);
              auVar176._0_4_ = auVar180._0_4_ * auVar115._0_4_;
              auVar176._4_4_ = auVar180._4_4_ * auVar115._4_4_;
              auVar176._8_4_ = auVar180._8_4_ * auVar115._8_4_;
              auVar176._12_4_ = auVar180._12_4_ * auVar115._12_4_;
              auVar313 = vinsertps_avx(auVar219,auVar313,0x1c);
              auVar313 = vdivps_avx(auVar313,auVar202);
              auVar115 = vhaddps_avx(auVar176,auVar176);
              auVar203._0_4_ = auVar180._0_4_ * auVar313._0_4_;
              auVar203._4_4_ = auVar180._4_4_ * auVar313._4_4_;
              auVar203._8_4_ = auVar180._8_4_ * auVar313._8_4_;
              auVar203._12_4_ = auVar180._12_4_ * auVar313._12_4_;
              auVar313 = vhaddps_avx(auVar203,auVar203);
              fVar276 = fVar276 - auVar115._0_4_;
              fVar247 = fVar247 - auVar313._0_4_;
              auVar284 = ZEXT464((uint)fVar247);
              auVar313 = vandps_avx(auVar290,local_a40._0_16_);
              bVar58 = true;
              if (auVar313._0_4_ < auVar305._0_4_) {
                auVar290 = vfmadd231ss_fma(ZEXT416((uint)(auVar272._0_4_ + auVar305._0_4_)),
                                           local_820._0_16_,ZEXT416(0x36000000));
                auVar313 = vandps_avx(auVar150,local_a40._0_16_);
                auVar115 = ZEXT816(0);
                bVar58 = true;
                if (auVar313._0_4_ < auVar290._0_4_) {
                  fVar247 = fVar247 + (float)local_950._0_4_;
                  auVar284 = ZEXT464((uint)fVar247);
                  if (fVar1 <= fVar247) {
                    fVar253 = *(float *)(ray + k * 4 + 0x100);
                    auVar298 = ZEXT464((uint)fVar253);
                    if (((fVar247 <= fVar253) && (0.0 <= fVar276)) && (fVar276 <= 1.0)) {
                      auVar6 = vrsqrtss_avx(auVar6,auVar6);
                      fVar254 = auVar6._0_4_;
                      pGVar8 = (context->scene->geometries).items[uVar104].ptr;
                      if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        unaff_BL = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          fVar113 = fVar254 * 1.5 + fVar113 * -0.5 * fVar254 * fVar254 * fVar254;
                          auVar145._0_4_ = fVar113 * (float)local_9a0._0_4_;
                          auVar145._4_4_ = fVar113 * (float)local_9a0._4_4_;
                          auVar145._8_4_ = fVar113 * fStack_998;
                          auVar145._12_4_ = fVar113 * fStack_994;
                          auVar180 = vfmadd213ps_fma(auVar121,auVar145,auVar241);
                          auVar6 = vshufps_avx(auVar145,auVar145,0xc9);
                          auVar313 = vshufps_avx(auVar241,auVar241,0xc9);
                          auVar146._0_4_ = auVar145._0_4_ * auVar313._0_4_;
                          auVar146._4_4_ = auVar145._4_4_ * auVar313._4_4_;
                          auVar146._8_4_ = auVar145._8_4_ * auVar313._8_4_;
                          auVar146._12_4_ = auVar145._12_4_ * auVar313._12_4_;
                          auVar290 = vfmsub231ps_fma(auVar146,auVar241,auVar6);
                          auVar6 = vshufps_avx(auVar290,auVar290,0xc9);
                          auVar313 = vshufps_avx(auVar180,auVar180,0xc9);
                          auVar290 = vshufps_avx(auVar290,auVar290,0xd2);
                          auVar119._0_4_ = auVar180._0_4_ * auVar290._0_4_;
                          auVar119._4_4_ = auVar180._4_4_ * auVar290._4_4_;
                          auVar119._8_4_ = auVar180._8_4_ * auVar290._8_4_;
                          auVar119._12_4_ = auVar180._12_4_ * auVar290._12_4_;
                          auVar313 = vfmsub231ps_fma(auVar119,auVar6,auVar313);
                          auVar163._4_4_ = fVar276;
                          auVar163._0_4_ = fVar276;
                          auVar163._8_4_ = fVar276;
                          auVar163._12_4_ = fVar276;
                          auVar163._16_4_ = fVar276;
                          auVar163._20_4_ = fVar276;
                          auVar163._24_4_ = fVar276;
                          auVar163._28_4_ = fVar276;
                          auVar6 = vmovshdup_avx(auVar313);
                          local_400._8_8_ = auVar6._0_8_;
                          auVar6 = vshufps_avx(auVar313,auVar313,0xaa);
                          local_3e0 = auVar6._0_8_;
                          local_3c0 = auVar313._0_4_;
                          local_400._0_8_ = local_400._8_8_;
                          local_400._16_8_ = local_400._8_8_;
                          local_400._24_8_ = local_400._8_8_;
                          uStack_3d8 = local_3e0;
                          uStack_3d0 = local_3e0;
                          uStack_3c8 = local_3e0;
                          uStack_3bc = local_3c0;
                          uStack_3b8 = local_3c0;
                          uStack_3b4 = local_3c0;
                          uStack_3b0 = local_3c0;
                          uStack_3ac = local_3c0;
                          uStack_3a8 = local_3c0;
                          uStack_3a4 = local_3c0;
                          local_3a0 = auVar163;
                          local_380 = ZEXT832(0) << 0x20;
                          local_360 = CONCAT44(uStack_61c,local_620);
                          uStack_358 = CONCAT44(uStack_614,uStack_618);
                          uStack_350 = CONCAT44(uStack_60c,uStack_610);
                          uStack_348 = CONCAT44(uStack_604,uStack_608);
                          local_340._4_4_ = uStack_5fc;
                          local_340._0_4_ = local_600;
                          local_340._8_4_ = uStack_5f8;
                          local_340._12_4_ = uStack_5f4;
                          local_340._16_4_ = uStack_5f0;
                          local_340._20_4_ = uStack_5ec;
                          local_340._24_4_ = uStack_5e8;
                          local_340._28_4_ = uStack_5e4;
                          vpcmpeqd_avx2(local_340,local_340);
                          local_320 = context->user->instID[0];
                          uStack_31c = local_320;
                          uStack_318 = local_320;
                          uStack_314 = local_320;
                          uStack_310 = local_320;
                          uStack_30c = local_320;
                          uStack_308 = local_320;
                          uStack_304 = local_320;
                          local_300 = context->user->instPrimID[0];
                          uStack_2fc = local_300;
                          uStack_2f8 = local_300;
                          uStack_2f4 = local_300;
                          uStack_2f0 = local_300;
                          uStack_2ec = local_300;
                          uStack_2e8 = local_300;
                          uStack_2e4 = local_300;
                          *(float *)(ray + k * 4 + 0x100) = fVar247;
                          local_980 = local_660._0_8_;
                          uStack_978 = local_660._8_8_;
                          uStack_970 = local_660._16_8_;
                          uStack_968 = local_660._24_8_;
                          local_a70.valid = (int *)&local_980;
                          local_a70.geometryUserPtr = pGVar8->userPtr;
                          local_a70.context = context->user;
                          local_a70.hit = (RTCHitN *)local_400;
                          local_a70.N = 8;
                          local_a70.ray = (RTCRayN *)ray;
                          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar305 = ZEXT1664(auVar305._0_16_);
                            (*pGVar8->occlusionFilterN)(&local_a70);
                            auVar171._8_56_ = extraout_var_03;
                            auVar171._0_8_ = extraout_XMM1_Qa;
                            auVar163 = auVar171._0_32_;
                            auVar115 = ZEXT816(0) << 0x20;
                          }
                          auVar80._8_8_ = uStack_978;
                          auVar80._0_8_ = local_980;
                          auVar80._16_8_ = uStack_970;
                          auVar80._24_8_ = uStack_968;
                          auVar222 = ZEXT1632(auVar115 << 0x20);
                          auVar133 = vpcmpeqd_avx2(auVar222,auVar80);
                          auVar233 = vpcmpeqd_avx2(auVar163,auVar163);
                          auVar132 = auVar233 & ~auVar133;
                          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar132 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar132 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar132 >> 0x7f,0) == '\0') &&
                                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar132 >> 0xbf,0) == '\0') &&
                              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar132[0x1f]) {
                            auVar133 = auVar133 ^ auVar233;
                          }
                          else {
                            p_Var9 = context->args->filter;
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar305 = ZEXT1664(auVar305._0_16_);
                              auVar137._0_8_ = (*p_Var9)(&local_a70);
                              auVar137._8_56_ = extraout_var_01;
                              auVar133 = auVar137._0_32_;
                              auVar222 = ZEXT832(0) << 0x40;
                            }
                            auVar81._8_8_ = uStack_978;
                            auVar81._0_8_ = local_980;
                            auVar81._16_8_ = uStack_970;
                            auVar81._24_8_ = uStack_968;
                            auVar132 = vpcmpeqd_avx2(auVar222,auVar81);
                            auVar133 = vpcmpeqd_avx2(auVar133,auVar133);
                            auVar133 = auVar132 ^ auVar133;
                            auVar188._8_4_ = 0xff800000;
                            auVar188._0_8_ = 0xff800000ff800000;
                            auVar188._12_4_ = 0xff800000;
                            auVar188._16_4_ = 0xff800000;
                            auVar188._20_4_ = 0xff800000;
                            auVar188._24_4_ = 0xff800000;
                            auVar188._28_4_ = 0xff800000;
                            auVar132 = vblendvps_avx(auVar188,*(undefined1 (*) [32])
                                                               (local_a70.ray + 0x100),auVar132);
                            *(undefined1 (*) [32])(local_a70.ray + 0x100) = auVar132;
                          }
                          auVar284 = ZEXT464((uint)fVar247);
                          auVar298 = ZEXT464((uint)fVar253);
                          bVar78 = (auVar133 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar79 = (auVar133 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar77 = (auVar133 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar76 = SUB321(auVar133 >> 0x7f,0) != '\0';
                          bVar75 = (auVar133 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar74 = SUB321(auVar133 >> 0xbf,0) != '\0';
                          bVar72 = (auVar133 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar58 = auVar133[0x1f] < '\0';
                          unaff_BL = ((((((bVar78 || bVar79) || bVar77) || bVar76) || bVar75) ||
                                      bVar74) || bVar72) || bVar58;
                          if (((((((!bVar78 && !bVar79) && !bVar77) && !bVar76) && !bVar75) &&
                               !bVar74) && !bVar72) && !bVar58) {
                            *(float *)(ray + k * 4 + 0x100) = fVar253;
                          }
                          bVar58 = false;
                          goto LAB_018a043c;
                        }
                        unaff_BL = 1;
                      }
                      bVar58 = false;
                      goto LAB_018a043c;
                    }
                  }
                  bVar58 = false;
                  unaff_BL = 0;
                }
              }
LAB_018a043c:
              if (!bVar58) goto LAB_018a0796;
              lVar107 = lVar107 + -1;
            } while (lVar107 != 0);
            unaff_BL = 0;
LAB_018a0796:
            unaff_BL = unaff_BL & 1;
            local_840 = CONCAT71((int7)(local_840 >> 8),(byte)local_840 | unaff_BL);
            uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar134._4_4_ = uVar109;
            auVar134._0_4_ = uVar109;
            auVar134._8_4_ = uVar109;
            auVar134._12_4_ = uVar109;
            auVar134._16_4_ = uVar109;
            auVar134._20_4_ = uVar109;
            auVar134._24_4_ = uVar109;
            auVar134._28_4_ = uVar109;
            auVar133 = vcmpps_avx(_local_8a0,auVar134,2);
            auVar132 = vandps_avx(auVar133,local_720);
            auVar217 = ZEXT3264(auVar132);
            auVar133 = local_720 & auVar133;
            uVar110 = local_860;
            local_720 = auVar132;
          } while ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar133 >> 0x7f,0) != '\0') ||
                     (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar133 >> 0xbf,0) != '\0') ||
                   (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar133[0x1f] < '\0');
        }
        auVar272 = ZEXT3264(auVar14);
        auVar138._0_4_ = fVar141 * (float)local_780._0_4_;
        auVar138._4_4_ = fVar141 * (float)local_780._4_4_;
        auVar138._8_4_ = fVar141 * fStack_778;
        auVar138._12_4_ = fVar141 * fStack_774;
        auVar138._16_4_ = fVar141 * fStack_770;
        auVar138._20_4_ = fVar141 * fStack_76c;
        auVar138._28_36_ = auVar217._28_36_;
        auVar138._24_4_ = fVar141 * fStack_768;
        auVar6 = vfmadd132ps_fma(local_920,auVar138._0_32_,_local_8e0);
        auVar6 = vfmadd213ps_fma(local_640,auVar183,ZEXT1632(auVar6));
        auVar132 = vandps_avx(ZEXT1632(auVar6),local_900);
        auVar164._8_4_ = 0x3e99999a;
        auVar164._0_8_ = 0x3e99999a3e99999a;
        auVar164._12_4_ = 0x3e99999a;
        auVar164._16_4_ = 0x3e99999a;
        auVar164._20_4_ = 0x3e99999a;
        auVar164._24_4_ = 0x3e99999a;
        auVar164._28_4_ = 0x3e99999a;
        auVar132 = vcmpps_avx(auVar132,auVar164,1);
        auVar133 = vorps_avx(auVar132,local_6e0);
        auVar165._0_4_ = auVar14._0_4_ + fVar12;
        auVar165._4_4_ = auVar14._4_4_ + fVar12;
        auVar165._8_4_ = auVar14._8_4_ + fVar12;
        auVar165._12_4_ = auVar14._12_4_ + fVar12;
        auVar165._16_4_ = auVar14._16_4_ + fVar12;
        auVar165._20_4_ = auVar14._20_4_ + fVar12;
        auVar165._24_4_ = auVar14._24_4_ + fVar12;
        auVar165._28_4_ = auVar14._28_4_ + fVar12;
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar189._4_4_ = uVar109;
        auVar189._0_4_ = uVar109;
        auVar189._8_4_ = uVar109;
        auVar189._12_4_ = uVar109;
        auVar189._16_4_ = uVar109;
        auVar189._20_4_ = uVar109;
        auVar189._24_4_ = uVar109;
        auVar189._28_4_ = uVar109;
        auVar132 = vcmpps_avx(auVar165,auVar189,2);
        _local_8a0 = vandps_avx(auVar132,_local_880);
        auVar166._8_4_ = 3;
        auVar166._0_8_ = 0x300000003;
        auVar166._12_4_ = 3;
        auVar166._16_4_ = 3;
        auVar166._20_4_ = 3;
        auVar166._24_4_ = 3;
        auVar166._28_4_ = 3;
        auVar190._8_4_ = 2;
        auVar190._0_8_ = 0x200000002;
        auVar190._12_4_ = 2;
        auVar190._16_4_ = 2;
        auVar190._20_4_ = 2;
        auVar190._24_4_ = 2;
        auVar190._28_4_ = 2;
        auVar132 = vblendvps_avx(auVar190,auVar166,auVar133);
        local_920 = vpcmpgtd_avx2(auVar132,local_700);
        auVar132 = vpandn_avx2(local_920,_local_8a0);
        auVar133 = _local_8a0 & ~local_920;
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0x7f,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar133 >> 0xbf,0) != '\0') ||
            (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar133[0x1f] < '\0') {
          auVar313 = vminps_avx(auVar4,auVar5);
          auVar6 = vmaxps_avx(auVar4,auVar5);
          auVar290 = vminps_avx(auVar2,auVar3);
          auVar115 = vminps_avx(auVar313,auVar290);
          auVar313 = vmaxps_avx(auVar2,auVar3);
          auVar290 = vmaxps_avx(auVar6,auVar313);
          local_7c0._8_4_ = 0x7fffffff;
          local_7c0._0_8_ = 0x7fffffff7fffffff;
          local_7c0._12_4_ = 0x7fffffff;
          auVar6 = vandps_avx(auVar115,local_7c0._0_16_);
          auVar313 = vandps_avx(auVar290,local_7c0._0_16_);
          auVar6 = vmaxps_avx(auVar6,auVar313);
          auVar313 = vmovshdup_avx(auVar6);
          auVar313 = vmaxss_avx(auVar313,auVar6);
          auVar6 = vshufpd_avx(auVar6,auVar6,1);
          auVar6 = vmaxss_avx(auVar6,auVar313);
          local_a00._0_4_ = auVar6._0_4_ * 1.9073486e-06;
          local_800._0_16_ = vshufps_avx(auVar290,auVar290,0xff);
          local_820 = _local_2e0;
          local_880._4_4_ = fVar12 + (float)local_2e0._4_4_;
          local_880._0_4_ = fVar12 + (float)local_2e0._0_4_;
          fStack_878 = fVar12 + fStack_2d8;
          fStack_874 = fVar12 + fStack_2d4;
          fStack_870 = fVar12 + fStack_2d0;
          fStack_86c = fVar12 + fStack_2cc;
          fStack_868 = fVar12 + fStack_2c8;
          fStack_864 = fVar12 + fStack_2c4;
          do {
            auVar167._8_4_ = 0x7f800000;
            auVar167._0_8_ = 0x7f8000007f800000;
            auVar167._12_4_ = 0x7f800000;
            auVar167._16_4_ = 0x7f800000;
            auVar167._20_4_ = 0x7f800000;
            auVar167._24_4_ = 0x7f800000;
            auVar167._28_4_ = 0x7f800000;
            auVar133 = vblendvps_avx(auVar167,local_820,auVar132);
            auVar233 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar233 = vminps_avx(auVar133,auVar233);
            auVar222 = vshufpd_avx(auVar233,auVar233,5);
            auVar233 = vminps_avx(auVar233,auVar222);
            auVar222 = vpermpd_avx2(auVar233,0x4e);
            auVar233 = vminps_avx(auVar233,auVar222);
            auVar233 = vcmpps_avx(auVar133,auVar233,0);
            auVar222 = auVar132 & auVar233;
            auVar133 = auVar132;
            if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar222 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar222 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar222 >> 0x7f,0) != '\0') ||
                  (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar222 >> 0xbf,0) != '\0') ||
                (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar222[0x1f] < '\0') {
              auVar133 = vandps_avx(auVar233,auVar132);
            }
            uVar108 = vmovmskps_avx(auVar133);
            iVar105 = 0;
            for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
              iVar105 = iVar105 + 1;
            }
            uVar108 = iVar105 << 2;
            local_740 = auVar132;
            *(undefined4 *)(local_740 + uVar108) = 0;
            fVar276 = *(float *)(local_6a0 + uVar108);
            uVar108 = *(uint *)(local_2c0 + uVar108);
            fVar247 = auVar11._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              fVar247 = sqrtf((float)local_9e0._0_4_);
            }
            auVar284 = ZEXT464(uVar108);
            local_a20._0_4_ = fVar247 * 1.9073486e-06;
            lVar107 = 5;
            do {
              fVar247 = auVar284._0_4_;
              auVar120._4_4_ = fVar247;
              auVar120._0_4_ = fVar247;
              auVar120._8_4_ = fVar247;
              auVar120._12_4_ = fVar247;
              auVar313 = vfmadd213ps_fma(auVar120,local_9d0,_DAT_01feba10);
              fVar257 = 1.0 - fVar276;
              fVar113 = fVar276 * fVar276;
              auVar121 = SUB6416(ZEXT464(0x40400000),0);
              auVar180 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar150 = ZEXT416((uint)fVar276);
              auVar290 = vfmadd213ss_fma(auVar121,auVar150,auVar180);
              auVar6 = vfmadd213ss_fma(auVar290,ZEXT416((uint)fVar113),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar115 = vfmadd213ss_fma(auVar121,ZEXT416((uint)fVar257),auVar180);
              auVar115 = vfmadd213ss_fma(auVar115,ZEXT416((uint)(fVar257 * fVar257)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar253 = fVar257 * fVar257 * -fVar276 * 0.5;
              fVar254 = auVar6._0_4_ * 0.5;
              fVar255 = auVar115._0_4_ * 0.5;
              fVar256 = fVar276 * fVar276 * -fVar257 * 0.5;
              auVar204._0_4_ = fVar256 * fVar194;
              auVar204._4_4_ = fVar256 * fStack_b7c;
              auVar204._8_4_ = fVar256 * fStack_b78;
              auVar204._12_4_ = fVar256 * fStack_b74;
              auVar220._4_4_ = fVar255;
              auVar220._0_4_ = fVar255;
              auVar220._8_4_ = fVar255;
              auVar220._12_4_ = fVar255;
              auVar6 = vfmadd132ps_fma(auVar220,auVar204,auVar2);
              auVar177._4_4_ = fVar254;
              auVar177._0_4_ = fVar254;
              auVar177._8_4_ = fVar254;
              auVar177._12_4_ = fVar254;
              auVar6 = vfmadd132ps_fma(auVar177,auVar6,auVar5);
              auVar205._4_4_ = fVar253;
              auVar205._0_4_ = fVar253;
              auVar205._8_4_ = fVar253;
              auVar205._12_4_ = fVar253;
              auVar6 = vfmadd132ps_fma(auVar205,auVar6,auVar4);
              auVar180 = vfmadd231ss_fma(auVar180,auVar150,ZEXT416(0x41100000));
              auVar115 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar150,ZEXT416(0x40800000)
                                        );
              local_7a0._0_16_ = auVar6;
              auVar6 = vsubps_avx(auVar313,auVar6);
              _local_9a0 = auVar6;
              auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
              auVar313 = vfmadd213ss_fma(auVar121,auVar150,ZEXT416(0xbf800000));
              fVar253 = auVar6._0_4_;
              if (fVar253 < 0.0) {
                local_a40._0_4_ = fVar113;
                auVar139._0_4_ = sqrtf(fVar253);
                auVar139._4_60_ = extraout_var_00;
                auVar290 = ZEXT416(auVar290._0_4_);
                auVar121 = auVar139._0_16_;
                fVar113 = (float)local_a40._0_4_;
              }
              else {
                auVar121 = vsqrtss_avx(auVar6,auVar6);
              }
              auVar290 = vfmadd213ss_fma(auVar290,ZEXT416((uint)(fVar276 + fVar276)),
                                         ZEXT416((uint)(fVar276 * fVar276 * 3.0)));
              auVar195 = SUB6416(ZEXT464(0x40000000),0);
              auVar241 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,auVar195);
              auVar282 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar257 * -3.0)),
                                         ZEXT416((uint)(fVar257 + fVar257)),auVar241);
              auVar289 = vfnmadd231ss_fma(ZEXT416((uint)(fVar276 * (fVar257 + fVar257))),
                                          ZEXT416((uint)fVar257),ZEXT416((uint)fVar257));
              auVar241 = vfmadd213ss_fma(ZEXT416((uint)(fVar257 * -2.0)),auVar150,
                                         ZEXT416((uint)fVar113));
              fVar113 = auVar289._0_4_ * 0.5;
              fVar254 = auVar290._0_4_ * 0.5;
              fVar255 = auVar282._0_4_ * 0.5;
              fVar256 = auVar241._0_4_ * 0.5;
              auVar206._0_4_ = fVar194 * fVar256;
              auVar206._4_4_ = fStack_b7c * fVar256;
              auVar206._8_4_ = fStack_b78 * fVar256;
              auVar206._12_4_ = fStack_b74 * fVar256;
              auVar178._4_4_ = fVar255;
              auVar178._0_4_ = fVar255;
              auVar178._8_4_ = fVar255;
              auVar178._12_4_ = fVar255;
              auVar290 = vfmadd213ps_fma(auVar178,auVar2,auVar206);
              auVar147._4_4_ = fVar254;
              auVar147._0_4_ = fVar254;
              auVar147._8_4_ = fVar254;
              auVar147._12_4_ = fVar254;
              auVar290 = vfmadd213ps_fma(auVar147,auVar5,auVar290);
              auVar292._4_4_ = fVar113;
              auVar292._0_4_ = fVar113;
              auVar292._8_4_ = fVar113;
              auVar292._12_4_ = fVar113;
              auVar241 = vfmadd213ps_fma(auVar292,auVar4,auVar290);
              auVar150 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar150,auVar195);
              local_ba0 = auVar313._0_4_;
              auVar122._0_4_ = fVar194 * local_ba0;
              auVar122._4_4_ = fStack_b7c * local_ba0;
              auVar122._8_4_ = fStack_b78 * local_ba0;
              auVar122._12_4_ = fStack_b74 * local_ba0;
              local_ac0 = auVar115._0_4_;
              auVar179._4_4_ = local_ac0;
              auVar179._0_4_ = local_ac0;
              auVar179._8_4_ = local_ac0;
              auVar179._12_4_ = local_ac0;
              auVar313 = vfmadd213ps_fma(auVar179,auVar2,auVar122);
              uVar109 = auVar180._0_4_;
              auVar207._4_4_ = uVar109;
              auVar207._0_4_ = uVar109;
              auVar207._8_4_ = uVar109;
              auVar207._12_4_ = uVar109;
              auVar313 = vfmadd213ps_fma(auVar207,auVar5,auVar313);
              auVar290 = vdpps_avx(auVar241,auVar241,0x7f);
              auVar148._0_4_ = auVar150._0_4_;
              auVar148._4_4_ = auVar148._0_4_;
              auVar148._8_4_ = auVar148._0_4_;
              auVar148._12_4_ = auVar148._0_4_;
              auVar180 = vfmadd213ps_fma(auVar148,auVar4,auVar313);
              auVar313 = vblendps_avx(auVar290,_DAT_01feba10,0xe);
              auVar115 = vrsqrtss_avx(auVar313,auVar313);
              fVar255 = auVar290._0_4_;
              fVar113 = auVar115._0_4_;
              auVar115 = vdpps_avx(auVar241,auVar180,0x7f);
              fVar113 = fVar113 * 1.5 + fVar255 * -0.5 * fVar113 * fVar113 * fVar113;
              auVar149._0_4_ = auVar180._0_4_ * fVar255;
              auVar149._4_4_ = auVar180._4_4_ * fVar255;
              auVar149._8_4_ = auVar180._8_4_ * fVar255;
              auVar149._12_4_ = auVar180._12_4_ * fVar255;
              fVar254 = auVar115._0_4_;
              auVar230._0_4_ = auVar241._0_4_ * fVar254;
              auVar230._4_4_ = auVar241._4_4_ * fVar254;
              fVar256 = auVar241._8_4_;
              auVar230._8_4_ = fVar256 * fVar254;
              fVar257 = auVar241._12_4_;
              auVar230._12_4_ = fVar257 * fVar254;
              auVar115 = vsubps_avx(auVar149,auVar230);
              auVar313 = vrcpss_avx(auVar313,auVar313);
              auVar180 = vfnmadd213ss_fma(auVar313,auVar290,auVar195);
              fVar254 = auVar313._0_4_ * auVar180._0_4_;
              auVar313 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                    ZEXT416((uint)(fVar247 * (float)local_a20._0_4_)));
              auVar272 = ZEXT1664(auVar313);
              auVar249._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
              auVar249._8_4_ = -fVar256;
              auVar249._12_4_ = -fVar257;
              auVar208._0_4_ = fVar113 * auVar115._0_4_ * fVar254;
              auVar208._4_4_ = fVar113 * auVar115._4_4_ * fVar254;
              auVar208._8_4_ = fVar113 * auVar115._8_4_ * fVar254;
              auVar208._12_4_ = fVar113 * auVar115._12_4_ * fVar254;
              auVar280._0_4_ = auVar241._0_4_ * fVar113;
              auVar280._4_4_ = auVar241._4_4_ * fVar113;
              auVar280._8_4_ = fVar256 * fVar113;
              auVar280._12_4_ = fVar257 * fVar113;
              if (fVar255 < -fVar255) {
                local_a40._0_16_ = auVar280;
                fVar113 = sqrtf(fVar255);
                auVar272 = ZEXT464(auVar313._0_4_);
                auVar121 = ZEXT416(auVar121._0_4_);
                auVar280 = local_a40._0_16_;
              }
              else {
                auVar290 = vsqrtss_avx(auVar290,auVar290);
                fVar113 = auVar290._0_4_;
              }
              auVar290 = vdpps_avx(_local_9a0,auVar280,0x7f);
              auVar282 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar121,auVar272._0_16_);
              auVar115 = vdpps_avx(auVar249,auVar280,0x7f);
              auVar180 = vdpps_avx(_local_9a0,auVar208,0x7f);
              auVar150 = vdpps_avx(local_9d0,auVar280,0x7f);
              auVar282 = vfmadd213ss_fma(ZEXT416((uint)(auVar121._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_a00._0_4_ / fVar113)),auVar282)
              ;
              auVar298 = ZEXT1664(auVar282);
              fVar113 = auVar115._0_4_ + auVar180._0_4_;
              auVar305 = ZEXT464((uint)fVar113);
              auVar123._0_4_ = auVar290._0_4_ * auVar290._0_4_;
              auVar123._4_4_ = auVar290._4_4_ * auVar290._4_4_;
              auVar123._8_4_ = auVar290._8_4_ * auVar290._8_4_;
              auVar123._12_4_ = auVar290._12_4_ * auVar290._12_4_;
              auVar115 = vdpps_avx(_local_9a0,auVar249,0x7f);
              auVar121 = vsubps_avx(auVar6,auVar123);
              auVar180 = vrsqrtss_avx(auVar121,auVar121);
              fVar255 = auVar121._0_4_;
              fVar254 = auVar180._0_4_;
              fVar254 = fVar254 * 1.5 + fVar255 * -0.5 * fVar254 * fVar254 * fVar254;
              auVar180 = vdpps_avx(_local_9a0,local_9d0,0x7f);
              auVar115 = vfnmadd231ss_fma(auVar115,auVar290,ZEXT416((uint)fVar113));
              auVar180 = vfnmadd231ss_fma(auVar180,auVar290,auVar150);
              if (fVar255 < 0.0) {
                local_a40._0_16_ = ZEXT416((uint)fVar113);
                local_9c0._0_4_ = fVar254;
                local_7e0._0_16_ = auVar180;
                fVar113 = sqrtf(fVar255);
                auVar305 = ZEXT1664(local_a40._0_16_);
                auVar298 = ZEXT464(auVar282._0_4_);
                auVar272 = ZEXT464(auVar313._0_4_);
                fVar254 = (float)local_9c0._0_4_;
                auVar180 = local_7e0._0_16_;
              }
              else {
                auVar313 = vsqrtss_avx(auVar121,auVar121);
                fVar113 = auVar313._0_4_;
              }
              auVar282 = vpermilps_avx(local_7a0._0_16_,0xff);
              auVar121 = vshufps_avx(auVar241,auVar241,0xff);
              auVar313 = vfmsub213ss_fma(auVar115,ZEXT416((uint)fVar254),auVar121);
              auVar209._0_8_ = auVar150._0_8_ ^ 0x8000000080000000;
              auVar209._8_4_ = auVar150._8_4_ ^ 0x80000000;
              auVar209._12_4_ = auVar150._12_4_ ^ 0x80000000;
              auVar221._0_8_ = auVar313._0_8_ ^ 0x8000000080000000;
              auVar221._8_4_ = auVar313._8_4_ ^ 0x80000000;
              auVar221._12_4_ = auVar313._12_4_ ^ 0x80000000;
              auVar180 = ZEXT416((uint)(auVar180._0_4_ * fVar254));
              auVar289 = auVar305._0_16_;
              auVar115 = vfmsub231ss_fma(ZEXT416((uint)(auVar150._0_4_ * auVar313._0_4_)),auVar289,
                                         auVar180);
              auVar313 = vinsertps_avx(auVar180,auVar209,0x10);
              uVar109 = auVar115._0_4_;
              auVar210._4_4_ = uVar109;
              auVar210._0_4_ = uVar109;
              auVar210._8_4_ = uVar109;
              auVar210._12_4_ = uVar109;
              auVar313 = vdivps_avx(auVar313,auVar210);
              auVar150 = ZEXT416((uint)(fVar113 - auVar282._0_4_));
              auVar180 = vinsertps_avx(auVar290,auVar150,0x10);
              auVar181._0_4_ = auVar180._0_4_ * auVar313._0_4_;
              auVar181._4_4_ = auVar180._4_4_ * auVar313._4_4_;
              auVar181._8_4_ = auVar180._8_4_ * auVar313._8_4_;
              auVar181._12_4_ = auVar180._12_4_ * auVar313._12_4_;
              auVar313 = vinsertps_avx(auVar221,auVar289,0x1c);
              auVar313 = vdivps_avx(auVar313,auVar210);
              auVar115 = vhaddps_avx(auVar181,auVar181);
              auVar211._0_4_ = auVar180._0_4_ * auVar313._0_4_;
              auVar211._4_4_ = auVar180._4_4_ * auVar313._4_4_;
              auVar211._8_4_ = auVar180._8_4_ * auVar313._8_4_;
              auVar211._12_4_ = auVar180._12_4_ * auVar313._12_4_;
              auVar313 = vhaddps_avx(auVar211,auVar211);
              fVar276 = fVar276 - auVar115._0_4_;
              fVar247 = fVar247 - auVar313._0_4_;
              auVar284 = ZEXT464((uint)fVar247);
              auVar313 = vandps_avx(auVar290,local_7c0._0_16_);
              bVar58 = true;
              if (auVar313._0_4_ < auVar298._0_4_) {
                auVar290 = vfmadd231ss_fma(ZEXT416((uint)(auVar272._0_4_ + auVar298._0_4_)),
                                           local_800._0_16_,ZEXT416(0x36000000));
                auVar313 = vandps_avx(auVar150,local_7c0._0_16_);
                auVar115 = ZEXT816(0);
                if (auVar313._0_4_ < auVar290._0_4_) {
                  fVar247 = fVar247 + (float)local_950._0_4_;
                  auVar284 = ZEXT464((uint)fVar247);
                  if (fVar1 <= fVar247) {
                    fVar113 = *(float *)(ray + k * 4 + 0x100);
                    auVar272 = ZEXT464((uint)fVar113);
                    if (((fVar247 <= fVar113) && (0.0 <= fVar276)) && (fVar276 <= 1.0)) {
                      auVar6 = vrsqrtss_avx(auVar6,auVar6);
                      fVar254 = auVar6._0_4_;
                      pGVar8 = (context->scene->geometries).items[uVar104].ptr;
                      if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = 1;
                          bVar58 = false;
                        }
                        else {
                          fVar253 = fVar254 * 1.5 + fVar253 * -0.5 * fVar254 * fVar254 * fVar254;
                          auVar151._0_4_ = fVar253 * (float)local_9a0._0_4_;
                          auVar151._4_4_ = fVar253 * (float)local_9a0._4_4_;
                          auVar151._8_4_ = fVar253 * fStack_998;
                          auVar151._12_4_ = fVar253 * fStack_994;
                          auVar180 = vfmadd213ps_fma(auVar121,auVar151,auVar241);
                          auVar6 = vshufps_avx(auVar151,auVar151,0xc9);
                          auVar313 = vshufps_avx(auVar241,auVar241,0xc9);
                          auVar152._0_4_ = auVar151._0_4_ * auVar313._0_4_;
                          auVar152._4_4_ = auVar151._4_4_ * auVar313._4_4_;
                          auVar152._8_4_ = auVar151._8_4_ * auVar313._8_4_;
                          auVar152._12_4_ = auVar151._12_4_ * auVar313._12_4_;
                          auVar290 = vfmsub231ps_fma(auVar152,auVar241,auVar6);
                          auVar6 = vshufps_avx(auVar290,auVar290,0xc9);
                          auVar313 = vshufps_avx(auVar180,auVar180,0xc9);
                          auVar290 = vshufps_avx(auVar290,auVar290,0xd2);
                          auVar124._0_4_ = auVar180._0_4_ * auVar290._0_4_;
                          auVar124._4_4_ = auVar180._4_4_ * auVar290._4_4_;
                          auVar124._8_4_ = auVar180._8_4_ * auVar290._8_4_;
                          auVar124._12_4_ = auVar180._12_4_ * auVar290._12_4_;
                          auVar313 = vfmsub231ps_fma(auVar124,auVar6,auVar313);
                          auVar168._4_4_ = fVar276;
                          auVar168._0_4_ = fVar276;
                          auVar168._8_4_ = fVar276;
                          auVar168._12_4_ = fVar276;
                          auVar168._16_4_ = fVar276;
                          auVar168._20_4_ = fVar276;
                          auVar168._24_4_ = fVar276;
                          auVar168._28_4_ = fVar276;
                          auVar6 = vmovshdup_avx(auVar313);
                          local_400._8_8_ = auVar6._0_8_;
                          auVar6 = vshufps_avx(auVar313,auVar313,0xaa);
                          local_3e0 = auVar6._0_8_;
                          local_3c0 = auVar313._0_4_;
                          local_400._0_8_ = local_400._8_8_;
                          local_400._16_8_ = local_400._8_8_;
                          local_400._24_8_ = local_400._8_8_;
                          uStack_3d8 = local_3e0;
                          uStack_3d0 = local_3e0;
                          uStack_3c8 = local_3e0;
                          uStack_3bc = local_3c0;
                          uStack_3b8 = local_3c0;
                          uStack_3b4 = local_3c0;
                          uStack_3b0 = local_3c0;
                          uStack_3ac = local_3c0;
                          uStack_3a8 = local_3c0;
                          uStack_3a4 = local_3c0;
                          local_3a0 = auVar168;
                          local_380 = ZEXT832(0) << 0x20;
                          local_360 = CONCAT44(uStack_61c,local_620);
                          uStack_358 = CONCAT44(uStack_614,uStack_618);
                          uStack_350 = CONCAT44(uStack_60c,uStack_610);
                          uStack_348 = CONCAT44(uStack_604,uStack_608);
                          local_340._4_4_ = uStack_5fc;
                          local_340._0_4_ = local_600;
                          local_340._8_4_ = uStack_5f8;
                          local_340._12_4_ = uStack_5f4;
                          local_340._16_4_ = uStack_5f0;
                          local_340._20_4_ = uStack_5ec;
                          local_340._24_4_ = uStack_5e8;
                          local_340._28_4_ = uStack_5e4;
                          vpcmpeqd_avx2(local_340,local_340);
                          local_320 = context->user->instID[0];
                          uStack_31c = local_320;
                          uStack_318 = local_320;
                          uStack_314 = local_320;
                          uStack_310 = local_320;
                          uStack_30c = local_320;
                          uStack_308 = local_320;
                          uStack_304 = local_320;
                          local_300 = context->user->instPrimID[0];
                          uStack_2fc = local_300;
                          uStack_2f8 = local_300;
                          uStack_2f4 = local_300;
                          uStack_2f0 = local_300;
                          uStack_2ec = local_300;
                          uStack_2e8 = local_300;
                          uStack_2e4 = local_300;
                          *(float *)(ray + k * 4 + 0x100) = fVar247;
                          local_980 = local_660._0_8_;
                          uStack_978 = local_660._8_8_;
                          uStack_970 = local_660._16_8_;
                          uStack_968 = local_660._24_8_;
                          local_a70.valid = (int *)&local_980;
                          local_a70.geometryUserPtr = pGVar8->userPtr;
                          local_a70.context = context->user;
                          local_a70.hit = (RTCHitN *)local_400;
                          local_a70.N = 8;
                          local_a70.ray = (RTCRayN *)ray;
                          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar298 = ZEXT1664(auVar298._0_16_);
                            auVar305 = ZEXT1664(auVar289);
                            (*pGVar8->occlusionFilterN)(&local_a70);
                            auVar172._8_56_ = extraout_var_04;
                            auVar172._0_8_ = extraout_XMM1_Qa_00;
                            auVar168 = auVar172._0_32_;
                            auVar115 = ZEXT816(0) << 0x20;
                          }
                          auVar82._8_8_ = uStack_978;
                          auVar82._0_8_ = local_980;
                          auVar82._16_8_ = uStack_970;
                          auVar82._24_8_ = uStack_968;
                          auVar222 = ZEXT1632(auVar115 << 0x20);
                          auVar133 = vpcmpeqd_avx2(auVar222,auVar82);
                          auVar233 = vpcmpeqd_avx2(auVar168,auVar168);
                          auVar132 = auVar233 & ~auVar133;
                          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar132 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar132 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar132 >> 0x7f,0) == '\0') &&
                                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar132 >> 0xbf,0) == '\0') &&
                              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar132[0x1f]) {
                            auVar133 = auVar133 ^ auVar233;
                          }
                          else {
                            p_Var9 = context->args->filter;
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar298 = ZEXT1664(auVar298._0_16_);
                              auVar305 = ZEXT1664(auVar305._0_16_);
                              auVar140._0_8_ = (*p_Var9)(&local_a70);
                              auVar140._8_56_ = extraout_var_02;
                              auVar133 = auVar140._0_32_;
                              auVar222 = ZEXT832(0) << 0x40;
                            }
                            auVar83._8_8_ = uStack_978;
                            auVar83._0_8_ = local_980;
                            auVar83._16_8_ = uStack_970;
                            auVar83._24_8_ = uStack_968;
                            auVar132 = vpcmpeqd_avx2(auVar222,auVar83);
                            auVar133 = vpcmpeqd_avx2(auVar133,auVar133);
                            auVar133 = auVar132 ^ auVar133;
                            auVar191._8_4_ = 0xff800000;
                            auVar191._0_8_ = 0xff800000ff800000;
                            auVar191._12_4_ = 0xff800000;
                            auVar191._16_4_ = 0xff800000;
                            auVar191._20_4_ = 0xff800000;
                            auVar191._24_4_ = 0xff800000;
                            auVar191._28_4_ = 0xff800000;
                            auVar132 = vblendvps_avx(auVar191,*(undefined1 (*) [32])
                                                               (local_a70.ray + 0x100),auVar132);
                            *(undefined1 (*) [32])(local_a70.ray + 0x100) = auVar132;
                          }
                          auVar284 = ZEXT464((uint)fVar247);
                          auVar272 = ZEXT464((uint)fVar113);
                          bVar78 = (auVar133 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar79 = (auVar133 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar77 = (auVar133 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar76 = SUB321(auVar133 >> 0x7f,0) != '\0';
                          bVar75 = (auVar133 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar74 = SUB321(auVar133 >> 0xbf,0) != '\0';
                          bVar72 = (auVar133 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar58 = auVar133[0x1f] < '\0';
                          unaff_BL = ((((((bVar78 || bVar79) || bVar77) || bVar76) || bVar75) ||
                                      bVar74) || bVar72) || bVar58;
                          if (((((((!bVar78 && !bVar79) && !bVar77) && !bVar76) && !bVar75) &&
                               !bVar74) && !bVar72) && !bVar58) {
                            *(float *)(ray + k * 4 + 0x100) = fVar113;
                          }
                          bVar58 = false;
                        }
                        goto LAB_018a1032;
                      }
                    }
                  }
                  bVar58 = false;
                  unaff_BL = 0;
                }
              }
LAB_018a1032:
              if (!bVar58) goto LAB_018a134a;
              lVar107 = lVar107 + -1;
            } while (lVar107 != 0);
            unaff_BL = 0;
LAB_018a134a:
            unaff_BL = unaff_BL & 1;
            local_840 = CONCAT71((int7)(local_840 >> 8),(byte)local_840 | unaff_BL);
            uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar135._4_4_ = uVar109;
            auVar135._0_4_ = uVar109;
            auVar135._8_4_ = uVar109;
            auVar135._12_4_ = uVar109;
            auVar135._16_4_ = uVar109;
            auVar135._20_4_ = uVar109;
            auVar135._24_4_ = uVar109;
            auVar135._28_4_ = uVar109;
            auVar133 = vcmpps_avx(_local_880,auVar135,2);
            auVar132 = vandps_avx(auVar133,local_740);
            local_740 = local_740 & auVar133;
            uVar110 = local_860;
          } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0x7f,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_740 >> 0xbf,0) != '\0') ||
                   (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_740[0x1f] < '\0');
        }
        auVar169._0_4_ = fVar12 + local_440._0_4_;
        auVar169._4_4_ = fVar12 + local_440._4_4_;
        auVar169._8_4_ = fVar12 + local_440._8_4_;
        auVar169._12_4_ = fVar12 + local_440._12_4_;
        auVar169._16_4_ = fVar12 + local_440._16_4_;
        auVar169._20_4_ = fVar12 + local_440._20_4_;
        auVar169._24_4_ = fVar12 + local_440._24_4_;
        auVar169._28_4_ = fVar12 + local_440._28_4_;
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar216._4_4_ = uVar109;
        auVar216._0_4_ = uVar109;
        auVar216._8_4_ = uVar109;
        auVar216._12_4_ = uVar109;
        auVar216._16_4_ = uVar109;
        auVar216._20_4_ = uVar109;
        auVar216._24_4_ = uVar109;
        auVar216._28_4_ = uVar109;
        auVar133 = vcmpps_avx(auVar169,auVar216,2);
        auVar132 = vandps_avx(auVar13,local_6c0);
        auVar132 = vandps_avx(auVar133,auVar132);
        auVar223._0_4_ = fVar12 + local_2e0._0_4_;
        auVar223._4_4_ = fVar12 + local_2e0._4_4_;
        auVar223._8_4_ = fVar12 + local_2e0._8_4_;
        auVar223._12_4_ = fVar12 + local_2e0._12_4_;
        auVar223._16_4_ = fVar12 + local_2e0._16_4_;
        auVar223._20_4_ = fVar12 + local_2e0._20_4_;
        auVar223._24_4_ = fVar12 + local_2e0._24_4_;
        auVar223._28_4_ = fVar12 + local_2e0._28_4_;
        auVar233 = vcmpps_avx(auVar223,auVar216,2);
        auVar133 = vandps_avx(local_920,_local_8a0);
        auVar133 = vandps_avx(auVar233,auVar133);
        auVar133 = vorps_avx(auVar132,auVar133);
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0x7f,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar133 >> 0xbf,0) != '\0') ||
            (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar133[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar106 * 0x60) = auVar133;
          auVar132 = vblendvps_avx(_local_2e0,local_440,auVar132);
          *(undefined1 (*) [32])(auStack_160 + uVar106 * 0x60) = auVar132;
          uVar114 = vmovlps_avx(local_940);
          *(undefined8 *)(afStack_140 + uVar106 * 0x18) = uVar114;
          auStack_138[uVar106 * 0x18] = (int)uVar110 + 1;
          uVar106 = (ulong)((int)uVar106 + 1);
        }
        auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      if ((int)uVar106 == 0) {
        if ((local_840 & 1) != 0) {
          return local_ca9;
        }
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar136._4_4_ = uVar109;
        auVar136._0_4_ = uVar109;
        auVar136._8_4_ = uVar109;
        auVar136._12_4_ = uVar109;
        auVar136._16_4_ = uVar109;
        auVar136._20_4_ = uVar109;
        auVar136._24_4_ = uVar109;
        auVar136._28_4_ = uVar109;
        auVar132 = vcmpps_avx(local_280,auVar136,2);
        uVar104 = vmovmskps_avx(auVar132);
        uVar104 = (uint)local_928 & uVar104;
        local_ca9 = uVar104 != 0;
        if (!local_ca9) {
          return local_ca9;
        }
        goto LAB_0189eb05;
      }
      uVar111 = (ulong)((int)uVar106 - 1);
      lVar107 = uVar111 * 0x60;
      auVar132 = *(undefined1 (*) [32])(auStack_160 + lVar107);
      auVar129._0_4_ = fVar12 + auVar132._0_4_;
      auVar129._4_4_ = fVar12 + auVar132._4_4_;
      auVar129._8_4_ = fVar12 + auVar132._8_4_;
      auVar129._12_4_ = fVar12 + auVar132._12_4_;
      auVar129._16_4_ = fVar12 + auVar132._16_4_;
      auVar129._20_4_ = fVar12 + auVar132._20_4_;
      auVar129._24_4_ = fVar12 + auVar132._24_4_;
      auVar129._28_4_ = fVar12 + auVar132._28_4_;
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar215._4_4_ = uVar109;
      auVar215._0_4_ = uVar109;
      auVar215._8_4_ = uVar109;
      auVar215._12_4_ = uVar109;
      auVar215._16_4_ = uVar109;
      auVar215._20_4_ = uVar109;
      auVar215._24_4_ = uVar109;
      auVar215._28_4_ = uVar109;
      auVar233 = vcmpps_avx(auVar129,auVar215,2);
      auVar133 = vandps_avx(auVar233,*(undefined1 (*) [32])(auStack_180 + lVar107));
      local_400 = auVar133;
      auVar13 = *(undefined1 (*) [32])(auStack_180 + lVar107) & auVar233;
      bVar78 = (auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar79 = (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar77 = (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar76 = SUB321(auVar13 >> 0x7f,0) == '\0';
      bVar75 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar74 = SUB321(auVar13 >> 0xbf,0) == '\0';
      bVar72 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar58 = -1 < auVar13[0x1f];
      if (((((((!bVar78 || !bVar79) || !bVar77) || !bVar76) || !bVar75) || !bVar74) || !bVar72) ||
          !bVar58) {
        auVar185._8_4_ = 0x7f800000;
        auVar185._0_8_ = 0x7f8000007f800000;
        auVar185._12_4_ = 0x7f800000;
        auVar185._16_4_ = 0x7f800000;
        auVar185._20_4_ = 0x7f800000;
        auVar185._24_4_ = 0x7f800000;
        auVar185._28_4_ = 0x7f800000;
        auVar132 = vblendvps_avx(auVar185,auVar132,auVar133);
        auVar233 = vshufps_avx(auVar132,auVar132,0xb1);
        auVar233 = vminps_avx(auVar132,auVar233);
        auVar13 = vshufpd_avx(auVar233,auVar233,5);
        auVar13 = vminps_avx(auVar233,auVar13);
        auVar233 = vpermpd_avx2(auVar13,0x4e);
        auVar13 = vminps_avx(auVar13,auVar233);
        auVar132 = vcmpps_avx(auVar132,auVar13,0);
        auVar13 = auVar133 & auVar132;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar133 = vandps_avx(auVar132,auVar133);
        }
        fVar276 = afStack_140[uVar111 * 0x18 + 1];
        uVar110 = (ulong)auStack_138[uVar111 * 0x18];
        uVar108 = vmovmskps_avx(auVar133);
        iVar105 = 0;
        for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
          iVar105 = iVar105 + 1;
        }
        fVar247 = afStack_140[uVar111 * 0x18];
        auVar130._4_4_ = fVar247;
        auVar130._0_4_ = fVar247;
        auVar130._8_4_ = fVar247;
        auVar130._12_4_ = fVar247;
        auVar130._16_4_ = fVar247;
        auVar130._20_4_ = fVar247;
        auVar130._24_4_ = fVar247;
        auVar130._28_4_ = fVar247;
        *(undefined4 *)(local_400 + (uint)(iVar105 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar107) = local_400;
        if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_400 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_400 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_400 >> 0x7f,0) != '\0') ||
              (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_400 >> 0xbf,0) != '\0') ||
            (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_400[0x1f] < '\0') {
          uVar111 = uVar106;
        }
        fVar276 = fVar276 - fVar247;
        auVar159._4_4_ = fVar276;
        auVar159._0_4_ = fVar276;
        auVar159._8_4_ = fVar276;
        auVar159._12_4_ = fVar276;
        auVar159._16_4_ = fVar276;
        auVar159._20_4_ = fVar276;
        auVar159._24_4_ = fVar276;
        auVar159._28_4_ = fVar276;
        auVar6 = vfmadd132ps_fma(auVar159,auVar130,_DAT_02020f20);
        local_440 = ZEXT1632(auVar6);
        local_940._8_8_ = 0;
        local_940._0_8_ = *(ulong *)(local_440 + (uint)(iVar105 << 2));
      }
      auVar217 = ZEXT3264(auVar233);
      uVar106 = uVar111;
      fVar276 = fVar12;
    } while (((((((bVar78 && bVar79) && bVar77) && bVar76) && bVar75) && bVar74) && bVar72) &&
             bVar58);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }